

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  RayHit *pRVar62;
  undefined1 auVar63 [8];
  float fVar64;
  undefined4 uVar65;
  float fVar66;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar89 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar100 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  vint4 ai_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  vint4 ai;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar155;
  float fVar157;
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar159;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  float fVar158;
  float fVar160;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined8 uVar161;
  vfloat4 a0_3;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar177;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar200 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  vfloat4 a0_1;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  float fVar222;
  float fVar232;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar233;
  float fVar234;
  float fVar245;
  float fVar247;
  undefined1 auVar235 [16];
  float fVar248;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar246;
  undefined1 auVar244 [32];
  vfloat4 a0;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar257 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  RayHit *local_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  undefined4 uStack_42c;
  undefined1 local_428 [32];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  Primitive *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [8];
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  undefined1 local_338 [16];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [32];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2bc;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar57;
  undefined1 auVar122 [32];
  
  PVar3 = prim[1];
  uVar61 = (ulong)(byte)PVar3;
  fVar139 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar67._0_4_ = fVar139 * auVar12._0_4_;
  auVar67._4_4_ = fVar139 * auVar12._4_4_;
  auVar67._8_4_ = fVar139 * auVar12._8_4_;
  auVar67._12_4_ = fVar139 * auVar12._12_4_;
  auVar141._0_4_ = fVar139 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar141._4_4_ = fVar139 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar141._8_4_ = fVar139 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar141._12_4_ = fVar139 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar270 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar270 = vcvtdq2ps_avx(auVar270);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar61 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar56 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar61 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar56 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar267._4_4_ = auVar141._0_4_;
  auVar267._0_4_ = auVar141._0_4_;
  auVar267._8_4_ = auVar141._0_4_;
  auVar267._12_4_ = auVar141._0_4_;
  auVar203 = vshufps_avx(auVar141,auVar141,0x55);
  auVar68 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar139 = auVar68._0_4_;
  auVar235._0_4_ = fVar139 * auVar270._0_4_;
  fVar156 = auVar68._4_4_;
  auVar235._4_4_ = fVar156 * auVar270._4_4_;
  fVar158 = auVar68._8_4_;
  auVar235._8_4_ = fVar158 * auVar270._8_4_;
  fVar160 = auVar68._12_4_;
  auVar235._12_4_ = fVar160 * auVar270._12_4_;
  auVar223._0_4_ = auVar11._0_4_ * fVar139;
  auVar223._4_4_ = auVar11._4_4_ * fVar156;
  auVar223._8_4_ = auVar11._8_4_ * fVar158;
  auVar223._12_4_ = auVar11._12_4_ * fVar160;
  auVar195._0_4_ = auVar99._0_4_ * fVar139;
  auVar195._4_4_ = auVar99._4_4_ * fVar156;
  auVar195._8_4_ = auVar99._8_4_ * fVar158;
  auVar195._12_4_ = auVar99._12_4_ * fVar160;
  auVar68 = vfmadd231ps_fma(auVar235,auVar203,auVar8);
  auVar87 = vfmadd231ps_fma(auVar223,auVar203,auVar10);
  auVar203 = vfmadd231ps_fma(auVar195,auVar69,auVar203);
  auVar113 = vfmadd231ps_fma(auVar68,auVar267,auVar12);
  auVar87 = vfmadd231ps_fma(auVar87,auVar267,auVar9);
  auVar129 = vfmadd231ps_fma(auVar203,auVar70,auVar267);
  auVar268._4_4_ = auVar67._0_4_;
  auVar268._0_4_ = auVar67._0_4_;
  auVar268._8_4_ = auVar67._0_4_;
  auVar268._12_4_ = auVar67._0_4_;
  auVar203 = vshufps_avx(auVar67,auVar67,0x55);
  auVar68 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar139 = auVar68._0_4_;
  auVar142._0_4_ = fVar139 * auVar270._0_4_;
  fVar156 = auVar68._4_4_;
  auVar142._4_4_ = fVar156 * auVar270._4_4_;
  fVar158 = auVar68._8_4_;
  auVar142._8_4_ = fVar158 * auVar270._8_4_;
  fVar160 = auVar68._12_4_;
  auVar142._12_4_ = fVar160 * auVar270._12_4_;
  auVar86._0_4_ = auVar11._0_4_ * fVar139;
  auVar86._4_4_ = auVar11._4_4_ * fVar156;
  auVar86._8_4_ = auVar11._8_4_ * fVar158;
  auVar86._12_4_ = auVar11._12_4_ * fVar160;
  auVar68._0_4_ = auVar99._0_4_ * fVar139;
  auVar68._4_4_ = auVar99._4_4_ * fVar156;
  auVar68._8_4_ = auVar99._8_4_ * fVar158;
  auVar68._12_4_ = auVar99._12_4_ * fVar160;
  auVar8 = vfmadd231ps_fma(auVar142,auVar203,auVar8);
  auVar270 = vfmadd231ps_fma(auVar86,auVar203,auVar10);
  auVar10 = vfmadd231ps_fma(auVar68,auVar203,auVar69);
  auVar11 = vfmadd231ps_fma(auVar8,auVar268,auVar12);
  auVar69 = vfmadd231ps_fma(auVar270,auVar268,auVar9);
  auVar99 = vfmadd231ps_fma(auVar10,auVar268,auVar70);
  local_338._8_4_ = 0x7fffffff;
  local_338._0_8_ = 0x7fffffff7fffffff;
  local_338._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar113,local_338);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar8 = vblendvps_avx(auVar113,auVar125,auVar12);
  auVar12 = vandps_avx(auVar87,local_338);
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar270 = vblendvps_avx(auVar87,auVar125,auVar12);
  auVar12 = vandps_avx(auVar129,local_338);
  auVar12 = vcmpps_avx(auVar12,auVar125,1);
  auVar12 = vblendvps_avx(auVar129,auVar125,auVar12);
  auVar9 = vrcpps_avx(auVar8);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = &DAT_3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar178);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar270);
  auVar270 = vfnmadd213ps_fma(auVar270,auVar8,auVar178);
  auVar10 = vfmadd132ps_fma(auVar270,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar8,auVar178);
  auVar70 = vfmadd132ps_fma(auVar12,auVar8,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar129._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar129._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar129._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar129._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar143._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar143._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar143._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar143._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar87._1_3_ = 0;
  auVar87[0] = PVar3;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar270);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar61 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar196._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar196._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar196._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar196._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar8);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar203._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar203._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar203._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar203._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar56 + uVar61 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar99);
  auVar113._0_4_ = auVar70._0_4_ * auVar12._0_4_;
  auVar113._4_4_ = auVar70._4_4_ * auVar12._4_4_;
  auVar113._8_4_ = auVar70._8_4_ * auVar12._8_4_;
  auVar113._12_4_ = auVar70._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar99);
  auVar69._0_4_ = auVar70._0_4_ * auVar12._0_4_;
  auVar69._4_4_ = auVar70._4_4_ * auVar12._4_4_;
  auVar69._8_4_ = auVar70._8_4_ * auVar12._8_4_;
  auVar69._12_4_ = auVar70._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar129,auVar143);
  auVar8 = vpminsd_avx(auVar196,auVar203);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vpminsd_avx(auVar113,auVar69);
  uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar212._4_4_ = uVar65;
  auVar212._0_4_ = uVar65;
  auVar212._8_4_ = uVar65;
  auVar212._12_4_ = uVar65;
  auVar8 = vmaxps_avx(auVar8,auVar212);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  local_298._0_4_ = auVar12._0_4_ * 0.99999964;
  local_298._4_4_ = auVar12._4_4_ * 0.99999964;
  local_298._8_4_ = auVar12._8_4_ * 0.99999964;
  local_298._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar129,auVar143);
  auVar8 = vpmaxsd_avx(auVar196,auVar203);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar8 = vpmaxsd_avx(auVar113,auVar69);
  fVar139 = (ray->super_RayK<1>).tfar;
  auVar99._4_4_ = fVar139;
  auVar99._0_4_ = fVar139;
  auVar99._8_4_ = fVar139;
  auVar99._12_4_ = fVar139;
  auVar8 = vminps_avx(auVar8,auVar99);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar70._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar87[4] = PVar3;
  auVar87._5_3_ = 0;
  auVar87[8] = PVar3;
  auVar87._9_3_ = 0;
  auVar87[0xc] = PVar3;
  auVar87._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar87,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_298,auVar70,2);
  auVar12 = vandps_avx(auVar12,auVar8);
  uVar52 = vmovmskps_avx(auVar12);
  if (uVar52 == 0) {
    return;
  }
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  uVar52 = uVar52 & 0xff;
  local_1f8 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  local_348 = 0x80000000;
  uStack_344 = 0x80000000;
  uStack_340 = 0x80000000;
  uStack_33c = 0x80000000;
  local_4a0 = ray;
  local_3f8 = prim;
LAB_016a5ac0:
  lVar58 = 0;
  for (uVar56 = (ulong)uVar52; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar55 = *(uint *)(local_3f8 + 2);
  pGVar4 = (context->scene->geometries).items[uVar55].ptr;
  local_3f0 = (ulong)*(uint *)(local_3f8 + lVar58 * 4 + 6);
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_3f8 + lVar58 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar56);
  lVar58 = uVar56 + 1;
  auVar8 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar58);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar270 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar56);
  auVar9 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar58);
  auVar71._8_4_ = 0x3eaaaaab;
  auVar71._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar71._12_4_ = 0x3eaaaaab;
  auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar56),auVar12,auVar71);
  auVar99 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * lVar58),auVar8,auVar71);
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar4[3].userPtr +
                             uVar56 * *(long *)&pGVar4[3].fnumTimeSegments),auVar270,auVar71);
  auVar203 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar4[3].userPtr +
                               *(long *)&pGVar4[3].fnumTimeSegments * lVar58),auVar9,auVar71);
  auVar87 = ZEXT816(0) << 0x40;
  auVar72._0_4_ = auVar8._0_4_ * 0.0;
  auVar72._4_4_ = auVar8._4_4_ * 0.0;
  auVar72._8_4_ = auVar8._8_4_ * 0.0;
  auVar72._12_4_ = auVar8._12_4_ * 0.0;
  auVar69 = vfmadd231ps_fma(auVar72,auVar99,auVar87);
  auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar69);
  local_408._0_4_ = auVar12._0_4_ + auVar70._0_4_;
  local_408._4_4_ = auVar12._4_4_ + auVar70._4_4_;
  fStack_400 = auVar12._8_4_ + auVar70._8_4_;
  fStack_3fc = auVar12._12_4_ + auVar70._12_4_;
  auVar257._8_4_ = 0x40400000;
  auVar257._0_8_ = 0x4040000040400000;
  auVar257._12_4_ = 0x40400000;
  auVar70 = vfmadd231ps_fma(auVar69,auVar10,auVar257);
  auVar68 = vfnmadd231ps_fma(auVar70,auVar12,auVar257);
  auVar213._0_4_ = auVar9._0_4_ * 0.0;
  auVar213._4_4_ = auVar9._4_4_ * 0.0;
  auVar213._8_4_ = auVar9._8_4_ * 0.0;
  auVar213._12_4_ = auVar9._12_4_ * 0.0;
  auVar69 = vfmadd231ps_fma(auVar213,auVar203,auVar87);
  auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar69);
  auVar249._0_4_ = auVar270._0_4_ + auVar70._0_4_;
  auVar249._4_4_ = auVar270._4_4_ + auVar70._4_4_;
  auVar249._8_4_ = auVar270._8_4_ + auVar70._8_4_;
  auVar249._12_4_ = auVar270._12_4_ + auVar70._12_4_;
  auVar70 = vfmadd231ps_fma(auVar69,auVar11,auVar257);
  auVar69 = vfnmadd231ps_fma(auVar70,auVar270,auVar257);
  auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar99,auVar8);
  auVar70 = vfmadd231ps_fma(auVar70,auVar10,auVar87);
  auVar70 = vfmadd231ps_fma(auVar70,auVar12,auVar87);
  auVar114._0_4_ = auVar8._0_4_ * 3.0;
  auVar114._4_4_ = auVar8._4_4_ * 3.0;
  auVar114._8_4_ = auVar8._8_4_ * 3.0;
  auVar114._12_4_ = auVar8._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar114,auVar257,auVar99);
  auVar8 = vfmadd231ps_fma(auVar8,auVar87,auVar10);
  auVar99 = vfnmadd231ps_fma(auVar8,auVar87,auVar12);
  auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar203,auVar9);
  auVar12 = vfmadd231ps_fma(auVar12,auVar11,auVar87);
  auVar10 = vfmadd231ps_fma(auVar12,auVar270,auVar87);
  auVar162._0_4_ = auVar9._0_4_ * 3.0;
  auVar162._4_4_ = auVar9._4_4_ * 3.0;
  auVar162._8_4_ = auVar9._8_4_ * 3.0;
  auVar162._12_4_ = auVar9._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar162,auVar257,auVar203);
  auVar12 = vfmadd231ps_fma(auVar12,auVar87,auVar11);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar87,auVar270);
  auVar12 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar8 = vshufps_avx(auVar249,auVar249,0xc9);
  fVar64 = auVar68._0_4_;
  auVar179._0_4_ = fVar64 * auVar8._0_4_;
  fVar85 = auVar68._4_4_;
  auVar179._4_4_ = fVar85 * auVar8._4_4_;
  fVar222 = auVar68._8_4_;
  auVar179._8_4_ = fVar222 * auVar8._8_4_;
  fVar232 = auVar68._12_4_;
  auVar179._12_4_ = fVar232 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar179,auVar12,auVar249);
  auVar270 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar197._0_4_ = auVar8._0_4_ * fVar64;
  auVar197._4_4_ = auVar8._4_4_ * fVar85;
  auVar197._8_4_ = auVar8._8_4_ * fVar222;
  auVar197._12_4_ = auVar8._12_4_ * fVar232;
  auVar12 = vfmsub231ps_fma(auVar197,auVar12,auVar69);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar99,auVar99,0xc9);
  auVar8 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar139 = auVar99._0_4_;
  auVar214._0_4_ = auVar8._0_4_ * fVar139;
  fVar156 = auVar99._4_4_;
  auVar214._4_4_ = auVar8._4_4_ * fVar156;
  fVar158 = auVar99._8_4_;
  auVar214._8_4_ = auVar8._8_4_ * fVar158;
  fVar160 = auVar99._12_4_;
  auVar214._12_4_ = auVar8._12_4_ * fVar160;
  auVar8 = vfmsub231ps_fma(auVar214,auVar12,auVar10);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar215._0_4_ = auVar8._0_4_ * fVar139;
  auVar215._4_4_ = auVar8._4_4_ * fVar156;
  auVar215._8_4_ = auVar8._8_4_ * fVar158;
  auVar215._12_4_ = auVar8._12_4_ * fVar160;
  auVar12 = vfmsub231ps_fma(auVar215,auVar12,auVar11);
  auVar11 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vdpps_avx(auVar270,auVar270,0x7f);
  fVar66 = auVar12._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar66;
  auVar8 = vrsqrtss_avx(auVar224,auVar224);
  fVar112 = auVar8._0_4_;
  fVar140 = fVar112 * 1.5 - fVar66 * 0.5 * fVar112 * fVar112 * fVar112;
  auVar8 = vdpps_avx(auVar270,auVar9,0x7f);
  fVar138 = fVar140 * auVar270._0_4_;
  fVar155 = fVar140 * auVar270._4_4_;
  fVar157 = fVar140 * auVar270._8_4_;
  fVar159 = fVar140 * auVar270._12_4_;
  auVar198._0_4_ = fVar66 * auVar9._0_4_;
  auVar198._4_4_ = fVar66 * auVar9._4_4_;
  auVar198._8_4_ = fVar66 * auVar9._8_4_;
  auVar198._12_4_ = fVar66 * auVar9._12_4_;
  fVar112 = auVar8._0_4_;
  auVar180._0_4_ = fVar112 * auVar270._0_4_;
  auVar180._4_4_ = fVar112 * auVar270._4_4_;
  auVar180._8_4_ = fVar112 * auVar270._8_4_;
  auVar180._12_4_ = fVar112 * auVar270._12_4_;
  auVar270 = vsubps_avx(auVar198,auVar180);
  auVar8 = vrcpss_avx(auVar224,auVar224);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar112 = auVar8._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar66 = auVar12._0_4_;
  auVar216._4_12_ = ZEXT812(0) << 0x20;
  auVar216._0_4_ = fVar66;
  auVar8 = vrsqrtss_avx(auVar216,auVar216);
  fVar177 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar10,auVar11,0x7f);
  fVar177 = fVar177 * 1.5 - fVar66 * 0.5 * fVar177 * fVar177 * fVar177;
  fVar233 = fVar177 * auVar10._0_4_;
  fVar245 = fVar177 * auVar10._4_4_;
  fVar247 = fVar177 * auVar10._8_4_;
  fVar248 = fVar177 * auVar10._12_4_;
  auVar163._0_4_ = fVar66 * auVar11._0_4_;
  auVar163._4_4_ = fVar66 * auVar11._4_4_;
  auVar163._8_4_ = fVar66 * auVar11._8_4_;
  auVar163._12_4_ = fVar66 * auVar11._12_4_;
  fVar66 = auVar8._0_4_;
  auVar126._0_4_ = fVar66 * auVar10._0_4_;
  auVar126._4_4_ = fVar66 * auVar10._4_4_;
  auVar126._8_4_ = fVar66 * auVar10._8_4_;
  auVar126._12_4_ = fVar66 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar163,auVar126);
  auVar8 = vrcpss_avx(auVar216,auVar216);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,ZEXT416(0x40000000));
  fVar66 = auVar12._0_4_ * auVar8._0_4_;
  auVar12 = vshufps_avx(_local_408,_local_408,0xff);
  auVar199._0_4_ = auVar12._0_4_ * fVar138;
  auVar199._4_4_ = auVar12._4_4_ * fVar155;
  auVar199._8_4_ = auVar12._8_4_ * fVar157;
  auVar199._12_4_ = auVar12._12_4_ * fVar159;
  local_358 = vsubps_avx(_local_408,auVar199);
  auVar8 = vshufps_avx(auVar68,auVar68,0xff);
  auVar144._0_4_ = auVar8._0_4_ * fVar138 + auVar12._0_4_ * fVar140 * fVar112 * auVar270._0_4_;
  auVar144._4_4_ = auVar8._4_4_ * fVar155 + auVar12._4_4_ * fVar140 * fVar112 * auVar270._4_4_;
  auVar144._8_4_ = auVar8._8_4_ * fVar157 + auVar12._8_4_ * fVar140 * fVar112 * auVar270._8_4_;
  auVar144._12_4_ = auVar8._12_4_ * fVar159 + auVar12._12_4_ * fVar140 * fVar112 * auVar270._12_4_;
  auVar270 = vsubps_avx(auVar68,auVar144);
  local_368._0_4_ = auVar199._0_4_ + (float)local_408._0_4_;
  local_368._4_4_ = auVar199._4_4_ + (float)local_408._4_4_;
  fStack_360 = auVar199._8_4_ + fStack_400;
  fStack_35c = auVar199._12_4_ + fStack_3fc;
  auVar12 = vshufps_avx(auVar70,auVar70,0xff);
  auVar88._0_4_ = fVar233 * auVar12._0_4_;
  auVar88._4_4_ = fVar245 * auVar12._4_4_;
  auVar88._8_4_ = fVar247 * auVar12._8_4_;
  auVar88._12_4_ = fVar248 * auVar12._12_4_;
  local_378 = vsubps_avx(auVar70,auVar88);
  auVar8 = vshufps_avx(auVar99,auVar99,0xff);
  auVar73._0_4_ = fVar233 * auVar8._0_4_ + auVar12._0_4_ * fVar177 * auVar9._0_4_ * fVar66;
  auVar73._4_4_ = fVar245 * auVar8._4_4_ + auVar12._4_4_ * fVar177 * auVar9._4_4_ * fVar66;
  auVar73._8_4_ = fVar247 * auVar8._8_4_ + auVar12._8_4_ * fVar177 * auVar9._8_4_ * fVar66;
  auVar73._12_4_ = fVar248 * auVar8._12_4_ + auVar12._12_4_ * fVar177 * auVar9._12_4_ * fVar66;
  auVar12 = vsubps_avx(auVar99,auVar73);
  local_3c8 = auVar70._0_4_ + auVar88._0_4_;
  fStack_3c4 = auVar70._4_4_ + auVar88._4_4_;
  fStack_3c0 = auVar70._8_4_ + auVar88._8_4_;
  fStack_3bc = auVar70._12_4_ + auVar88._12_4_;
  local_388._0_4_ = local_358._0_4_ + auVar270._0_4_ * 0.33333334;
  local_388._4_4_ = local_358._4_4_ + auVar270._4_4_ * 0.33333334;
  local_388._8_4_ = local_358._8_4_ + auVar270._8_4_ * 0.33333334;
  local_388._12_4_ = local_358._12_4_ + auVar270._12_4_ * 0.33333334;
  auVar74._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar74._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar74._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar74._12_4_ = auVar12._12_4_ * 0.33333334;
  local_398 = vsubps_avx(local_378,auVar74);
  aVar1 = (local_4a0->super_RayK<1>).org.field_0;
  auVar270 = vsubps_avx(local_358,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar270,auVar270,0x55);
  auVar8 = vshufps_avx(auVar270,auVar270,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar112 = (pre->ray_space).vz.field_0.m128[0];
  fVar66 = (pre->ray_space).vz.field_0.m128[1];
  fVar140 = (pre->ray_space).vz.field_0.m128[2];
  fVar177 = (pre->ray_space).vz.field_0.m128[3];
  auVar75._0_4_ = fVar112 * auVar8._0_4_;
  auVar75._4_4_ = fVar66 * auVar8._4_4_;
  auVar75._8_4_ = fVar140 * auVar8._8_4_;
  auVar75._12_4_ = fVar177 * auVar8._12_4_;
  auVar99 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_388,(undefined1  [16])aVar1);
  local_448 = auVar8._0_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar76._0_4_ = fVar112 * auVar8._0_4_;
  auVar76._4_4_ = fVar66 * auVar8._4_4_;
  auVar76._8_4_ = fVar140 * auVar8._8_4_;
  auVar76._12_4_ = fVar177 * auVar8._12_4_;
  auVar203 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_398,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar77._0_4_ = fVar112 * auVar12._0_4_;
  auVar77._4_4_ = fVar66 * auVar12._4_4_;
  auVar77._8_4_ = fVar140 * auVar12._8_4_;
  auVar77._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar68 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar78._0_4_ = fVar112 * auVar12._0_4_;
  auVar78._4_4_ = fVar66 * auVar12._4_4_;
  auVar78._8_4_ = fVar140 * auVar12._8_4_;
  auVar78._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar87 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(_local_368,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar145._0_4_ = fVar112 * auVar12._0_4_;
  auVar145._4_4_ = fVar66 * auVar12._4_4_;
  auVar145._8_4_ = fVar140 * auVar12._8_4_;
  auVar145._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar113 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar12);
  local_3a8._0_4_ = (fVar64 + auVar144._0_4_) * 0.33333334 + (float)local_368._0_4_;
  local_3a8._4_4_ = (fVar85 + auVar144._4_4_) * 0.33333334 + (float)local_368._4_4_;
  fStack_3a0 = (fVar222 + auVar144._8_4_) * 0.33333334 + fStack_360;
  fStack_39c = (fVar232 + auVar144._12_4_) * 0.33333334 + fStack_35c;
  auVar11 = vsubps_avx(_local_3a8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar225._0_4_ = fVar112 * auVar12._0_4_;
  auVar225._4_4_ = fVar66 * auVar12._4_4_;
  auVar225._8_4_ = fVar140 * auVar12._8_4_;
  auVar225._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar129 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar12);
  auVar236._0_4_ = (fVar139 + auVar73._0_4_) * 0.33333334;
  auVar236._4_4_ = (fVar156 + auVar73._4_4_) * 0.33333334;
  auVar236._8_4_ = (fVar158 + auVar73._8_4_) * 0.33333334;
  auVar236._12_4_ = (fVar160 + auVar73._12_4_) * 0.33333334;
  auVar46._4_4_ = fStack_3c4;
  auVar46._0_4_ = local_3c8;
  auVar46._8_4_ = fStack_3c0;
  auVar46._12_4_ = fStack_3bc;
  _local_3b8 = vsubps_avx(auVar46,auVar236);
  auVar70 = vsubps_avx(_local_3b8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar237._0_4_ = fVar112 * auVar12._0_4_;
  auVar237._4_4_ = fVar66 * auVar12._4_4_;
  auVar237._8_4_ = fVar140 * auVar12._8_4_;
  auVar237._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar70,auVar70,0x55);
  auVar67 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar2,auVar12);
  auVar69 = vsubps_avx(auVar46,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar181._0_4_ = fVar112 * auVar12._0_4_;
  auVar181._4_4_ = fVar66 * auVar12._4_4_;
  auVar181._8_4_ = fVar140 * auVar12._8_4_;
  auVar181._12_4_ = fVar177 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar69,auVar69,0x55);
  auVar12 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar2,auVar12);
  local_408._0_4_ = auVar270._0_4_;
  auVar164._4_4_ = local_408._0_4_;
  auVar164._0_4_ = local_408._0_4_;
  auVar164._8_4_ = local_408._0_4_;
  auVar164._12_4_ = local_408._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar99 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar2,auVar164);
  auVar165._4_4_ = local_448;
  auVar165._0_4_ = local_448;
  auVar165._8_4_ = local_448;
  auVar165._12_4_ = local_448;
  auVar203 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar165);
  uVar65 = auVar8._0_4_;
  auVar166._4_4_ = uVar65;
  auVar166._0_4_ = uVar65;
  auVar166._8_4_ = uVar65;
  auVar166._12_4_ = uVar65;
  auVar68 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar2,auVar166);
  uVar65 = auVar9._0_4_;
  auVar167._4_4_ = uVar65;
  auVar167._0_4_ = uVar65;
  auVar167._8_4_ = uVar65;
  auVar167._12_4_ = uVar65;
  auVar9 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar2,auVar167);
  uVar65 = auVar10._0_4_;
  auVar168._4_4_ = uVar65;
  auVar168._0_4_ = uVar65;
  auVar168._8_4_ = uVar65;
  auVar168._12_4_ = uVar65;
  auVar10 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar2,auVar168);
  uVar65 = auVar11._0_4_;
  auVar169._4_4_ = uVar65;
  auVar169._0_4_ = uVar65;
  auVar169._8_4_ = uVar65;
  auVar169._12_4_ = uVar65;
  auVar11 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar169);
  uVar65 = auVar70._0_4_;
  auVar79._4_4_ = uVar65;
  auVar79._0_4_ = uVar65;
  auVar79._8_4_ = uVar65;
  auVar79._12_4_ = uVar65;
  auVar70 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar79);
  uVar65 = auVar69._0_4_;
  auVar80._4_4_ = uVar65;
  auVar80._0_4_ = uVar65;
  auVar80._8_4_ = uVar65;
  auVar80._12_4_ = uVar65;
  auVar69 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar80);
  local_458 = vmovlhps_avx(auVar99,auVar10);
  local_468 = vmovlhps_avx(auVar203,auVar11);
  local_478 = vmovlhps_avx(auVar68,auVar70);
  _local_238 = vmovlhps_avx(auVar9,auVar69);
  auVar12 = vminps_avx(local_458,local_468);
  auVar8 = vminps_avx(local_478,_local_238);
  auVar270 = vminps_avx(auVar12,auVar8);
  auVar12 = vmaxps_avx(local_458,local_468);
  auVar8 = vmaxps_avx(local_478,_local_238);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vshufpd_avx(auVar270,auVar270,3);
  auVar270 = vminps_avx(auVar270,auVar8);
  auVar8 = vshufpd_avx(auVar12,auVar12,3);
  auVar8 = vmaxps_avx(auVar12,auVar8);
  auVar12 = vandps_avx(local_338,auVar270);
  auVar8 = vandps_avx(local_338,auVar8);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar8,auVar12);
  auVar63 = (undefined1  [8])((ulong)uVar52 + 0xf);
  local_198 = auVar12._0_4_ * 9.536743e-07;
  local_4c8._8_8_ = auVar99._0_8_;
  local_4c8._0_8_ = auVar99._0_8_;
  auVar279 = ZEXT1664(local_4c8);
  auVar200._8_8_ = auVar203._0_8_;
  auVar200._0_8_ = auVar203._0_8_;
  auVar89._8_8_ = auVar68._0_8_;
  auVar89._0_8_ = auVar68._0_8_;
  auVar100._8_8_ = auVar9._0_8_;
  auVar100._0_8_ = auVar9._0_8_;
  local_4d8._8_8_ = auVar70._0_8_;
  local_4d8._0_8_ = auVar70._0_8_;
  auVar170._8_8_ = auVar69._0_8_;
  auVar170._0_8_ = auVar69._0_8_;
  _local_408 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_348;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  uVar56 = 0;
  local_208 = vsubps_avx(local_468,local_458);
  local_218 = vsubps_avx(local_478,local_468);
  local_228 = vsubps_avx(_local_238,local_478);
  auVar266 = ZEXT1664(local_4d8);
  local_258 = vsubps_avx(_local_368,local_358);
  local_268 = vsubps_avx(_local_3a8,local_388);
  local_278 = vsubps_avx(_local_3b8,local_398);
  auVar47._4_4_ = fStack_3c4;
  auVar47._0_4_ = local_3c8;
  auVar47._8_4_ = fStack_3c0;
  auVar47._12_4_ = fStack_3bc;
  _local_288 = vsubps_avx(auVar47,local_378);
  local_4b8 = ZEXT816(0x3f80000000000000);
  local_4e8 = auVar170;
  pRVar62 = local_4a0;
  local_248 = local_4b8;
  do {
    auVar12 = vshufps_avx(local_4b8,local_4b8,0x50);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar122._16_4_ = 0x3f800000;
    auVar122._0_16_ = auVar115;
    auVar122._20_4_ = 0x3f800000;
    auVar122._24_4_ = 0x3f800000;
    auVar122._28_4_ = 0x3f800000;
    auVar8 = vsubps_avx(auVar115,auVar12);
    fVar139 = auVar12._0_4_;
    fVar234 = auVar10._0_4_;
    auVar81._0_4_ = fVar234 * fVar139;
    fVar156 = auVar12._4_4_;
    fVar246 = auVar10._4_4_;
    auVar81._4_4_ = fVar246 * fVar156;
    fVar158 = auVar12._8_4_;
    auVar81._8_4_ = fVar234 * fVar158;
    fVar160 = auVar12._12_4_;
    auVar81._12_4_ = fVar246 * fVar160;
    fVar64 = auVar11._0_4_;
    auVar146._0_4_ = fVar64 * fVar139;
    fVar85 = auVar11._4_4_;
    auVar146._4_4_ = fVar85 * fVar156;
    auVar146._8_4_ = fVar64 * fVar158;
    auVar146._12_4_ = fVar85 * fVar160;
    auVar182._0_4_ = auVar266._0_4_ * fVar139;
    auVar182._4_4_ = auVar266._4_4_ * fVar156;
    auVar182._8_4_ = auVar266._8_4_ * fVar158;
    auVar182._12_4_ = auVar266._12_4_ * fVar160;
    auVar269._0_4_ = auVar170._0_4_ * fVar139;
    auVar269._4_4_ = auVar170._4_4_ * fVar156;
    auVar269._8_4_ = auVar170._8_4_ * fVar158;
    auVar269._12_4_ = auVar170._12_4_ * fVar160;
    auVar70 = vfmadd231ps_fma(auVar81,auVar8,auVar279._0_16_);
    auVar69 = vfmadd231ps_fma(auVar146,auVar8,auVar200);
    auVar99 = vfmadd231ps_fma(auVar182,auVar8,auVar89);
    auVar203 = vfmadd231ps_fma(auVar269,auVar100,auVar8);
    auVar12 = vmovshdup_avx(local_248);
    fVar139 = local_248._0_4_;
    fVar112 = (auVar12._0_4_ - fVar139) * 0.04761905;
    auVar211._4_4_ = fVar139;
    auVar211._0_4_ = fVar139;
    auVar211._8_4_ = fVar139;
    auVar211._12_4_ = fVar139;
    auVar211._16_4_ = fVar139;
    auVar211._20_4_ = fVar139;
    auVar211._24_4_ = fVar139;
    auVar211._28_4_ = fVar139;
    auVar109._0_8_ = auVar12._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    auVar84 = vsubps_avx(auVar109,auVar211);
    uVar65 = auVar70._0_4_;
    auVar278._4_4_ = uVar65;
    auVar278._0_4_ = uVar65;
    auVar278._8_4_ = uVar65;
    auVar278._12_4_ = uVar65;
    auVar278._16_4_ = uVar65;
    auVar278._20_4_ = uVar65;
    auVar278._24_4_ = uVar65;
    auVar278._28_4_ = uVar65;
    auVar12 = vmovshdup_avx(auVar70);
    uVar161 = auVar12._0_8_;
    auVar264._8_8_ = uVar161;
    auVar264._0_8_ = uVar161;
    auVar264._16_8_ = uVar161;
    auVar264._24_8_ = uVar161;
    fVar66 = auVar69._0_4_;
    auVar97._4_4_ = fVar66;
    auVar97._0_4_ = fVar66;
    auVar97._8_4_ = fVar66;
    auVar97._12_4_ = fVar66;
    auVar97._16_4_ = fVar66;
    auVar97._20_4_ = fVar66;
    auVar97._24_4_ = fVar66;
    auVar97._28_4_ = fVar66;
    auVar8 = vmovshdup_avx(auVar69);
    auVar174._0_8_ = auVar8._0_8_;
    auVar174._8_8_ = auVar174._0_8_;
    auVar174._16_8_ = auVar174._0_8_;
    auVar174._24_8_ = auVar174._0_8_;
    fVar222 = auVar99._0_4_;
    auVar244._4_4_ = fVar222;
    auVar244._0_4_ = fVar222;
    auVar244._8_4_ = fVar222;
    auVar244._12_4_ = fVar222;
    auVar244._16_4_ = fVar222;
    auVar244._20_4_ = fVar222;
    auVar244._24_4_ = fVar222;
    auVar244._28_4_ = fVar222;
    auVar270 = vmovshdup_avx(auVar99);
    auVar221._0_8_ = auVar270._0_8_;
    auVar221._8_8_ = auVar221._0_8_;
    auVar221._16_8_ = auVar221._0_8_;
    auVar221._24_8_ = auVar221._0_8_;
    local_448 = auVar203._0_4_;
    auVar9 = vmovshdup_avx(auVar203);
    auVar68 = vfmadd132ps_fma(auVar84,auVar211,_DAT_02020f20);
    auVar84 = vsubps_avx(auVar122,ZEXT1632(auVar68));
    fVar139 = auVar68._0_4_;
    auVar272._0_4_ = fVar66 * fVar139;
    fVar156 = auVar68._4_4_;
    auVar272._4_4_ = fVar66 * fVar156;
    fVar158 = auVar68._8_4_;
    auVar272._8_4_ = fVar66 * fVar158;
    fVar160 = auVar68._12_4_;
    auVar272._12_4_ = fVar66 * fVar160;
    auVar272._16_4_ = fVar66 * 0.0;
    auVar272._20_4_ = fVar66 * 0.0;
    auVar272._24_4_ = fVar66 * 0.0;
    auVar272._28_4_ = 0;
    auVar68 = vfmadd231ps_fma(auVar272,auVar84,auVar278);
    fVar140 = auVar8._0_4_;
    auVar254._0_4_ = fVar140 * fVar139;
    fVar177 = auVar8._4_4_;
    auVar254._4_4_ = fVar177 * fVar156;
    auVar254._8_4_ = fVar140 * fVar158;
    auVar254._12_4_ = fVar177 * fVar160;
    auVar254._16_4_ = fVar140 * 0.0;
    auVar254._20_4_ = fVar177 * 0.0;
    auVar254._24_4_ = fVar140 * 0.0;
    auVar254._28_4_ = 0;
    auVar87 = vfmadd231ps_fma(auVar254,auVar84,auVar264);
    auVar13._4_4_ = fVar222 * fVar156;
    auVar13._0_4_ = fVar222 * fVar139;
    auVar13._8_4_ = fVar222 * fVar158;
    auVar13._12_4_ = fVar222 * fVar160;
    auVar13._16_4_ = fVar222 * 0.0;
    auVar13._20_4_ = fVar222 * 0.0;
    auVar13._24_4_ = fVar222 * 0.0;
    auVar13._28_4_ = auVar12._4_4_;
    auVar113 = vfmadd231ps_fma(auVar13,auVar84,auVar97);
    fVar140 = auVar270._0_4_;
    fVar177 = auVar270._4_4_;
    auVar14._4_4_ = fVar177 * fVar156;
    auVar14._0_4_ = fVar140 * fVar139;
    auVar14._8_4_ = fVar140 * fVar158;
    auVar14._12_4_ = fVar177 * fVar160;
    auVar14._16_4_ = fVar140 * 0.0;
    auVar14._20_4_ = fVar177 * 0.0;
    auVar14._24_4_ = fVar140 * 0.0;
    auVar14._28_4_ = uVar65;
    auVar129 = vfmadd231ps_fma(auVar14,auVar84,auVar174);
    auVar12 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar175._0_8_ = auVar12._0_8_;
    auVar175._8_8_ = auVar175._0_8_;
    auVar175._16_8_ = auVar175._0_8_;
    auVar175._24_8_ = auVar175._0_8_;
    auVar8 = vshufps_avx(auVar70,auVar70,0xff);
    uStack_3e0 = auVar8._0_8_;
    local_3e8 = (undefined1  [8])uStack_3e0;
    uStack_3d8 = uStack_3e0;
    uStack_3d0 = uStack_3e0;
    auVar15._4_4_ = fVar156 * local_448;
    auVar15._0_4_ = fVar139 * local_448;
    auVar15._8_4_ = fVar158 * local_448;
    auVar15._12_4_ = fVar160 * local_448;
    auVar15._16_4_ = local_448 * 0.0;
    auVar15._20_4_ = local_448 * 0.0;
    auVar15._24_4_ = local_448 * 0.0;
    auVar15._28_4_ = 0x3f800000;
    auVar67 = vfmadd231ps_fma(auVar15,auVar84,auVar244);
    auVar270 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar136._0_8_ = auVar270._0_8_;
    auVar136._8_8_ = auVar136._0_8_;
    auVar136._16_8_ = auVar136._0_8_;
    auVar136._24_8_ = auVar136._0_8_;
    auVar70 = vshufps_avx(auVar69,auVar69,0xff);
    auVar154._0_8_ = auVar70._0_8_;
    auVar154._8_8_ = auVar154._0_8_;
    auVar154._16_8_ = auVar154._0_8_;
    auVar154._24_8_ = auVar154._0_8_;
    fVar140 = auVar9._0_4_;
    fVar177 = auVar9._4_4_;
    auVar16._4_4_ = fVar177 * fVar156;
    auVar16._0_4_ = fVar140 * fVar139;
    auVar16._8_4_ = fVar140 * fVar158;
    auVar16._12_4_ = fVar177 * fVar160;
    auVar16._16_4_ = fVar140 * 0.0;
    auVar16._20_4_ = fVar177 * 0.0;
    auVar16._24_4_ = fVar140 * 0.0;
    auVar16._28_4_ = fVar222;
    auVar86 = vfmadd231ps_fma(auVar16,auVar84,auVar221);
    auVar18._28_4_ = fVar66;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar113._12_4_ * fVar160,
                            CONCAT48(auVar113._8_4_ * fVar158,
                                     CONCAT44(auVar113._4_4_ * fVar156,auVar113._0_4_ * fVar139))));
    auVar68 = vfmadd231ps_fma(auVar18,auVar84,ZEXT1632(auVar68));
    auVar256._28_4_ = auVar8._4_4_;
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(auVar129._12_4_ * fVar160,
                            CONCAT48(auVar129._8_4_ * fVar158,
                                     CONCAT44(auVar129._4_4_ * fVar156,auVar129._0_4_ * fVar139))));
    auVar87 = vfmadd231ps_fma(auVar256,auVar84,ZEXT1632(auVar87));
    auVar8 = vshufps_avx(auVar99,auVar99,0xaa);
    uVar161 = auVar8._0_8_;
    auVar255._8_8_ = uVar161;
    auVar255._0_8_ = uVar161;
    auVar255._16_8_ = uVar161;
    auVar255._24_8_ = uVar161;
    auVar9 = vshufps_avx(auVar99,auVar99,0xff);
    uVar161 = auVar9._0_8_;
    auVar273._8_8_ = uVar161;
    auVar273._0_8_ = uVar161;
    auVar273._16_8_ = uVar161;
    auVar273._24_8_ = uVar161;
    auVar113 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar67._12_4_,
                                                  CONCAT48(fVar158 * auVar67._8_4_,
                                                           CONCAT44(fVar156 * auVar67._4_4_,
                                                                    fVar139 * auVar67._0_4_)))),
                               auVar84,ZEXT1632(auVar113));
    auVar69 = vshufps_avx(auVar203,auVar203,0xaa);
    auVar99 = vshufps_avx(auVar203,auVar203,0xff);
    local_448 = auVar99._0_4_;
    fStack_444 = auVar99._4_4_;
    auVar19._28_4_ = fStack_444;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar160,
                            CONCAT48(auVar86._8_4_ * fVar158,
                                     CONCAT44(auVar86._4_4_ * fVar156,auVar86._0_4_ * fVar139))));
    auVar99 = vfmadd231ps_fma(auVar19,auVar84,ZEXT1632(auVar129));
    auVar203 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar113._12_4_,
                                                  CONCAT48(fVar158 * auVar113._8_4_,
                                                           CONCAT44(fVar156 * auVar113._4_4_,
                                                                    fVar139 * auVar113._0_4_)))),
                               auVar84,ZEXT1632(auVar68));
    auVar13 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar68));
    auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar99._12_4_,
                                                 CONCAT48(fVar158 * auVar99._8_4_,
                                                          CONCAT44(fVar156 * auVar99._4_4_,
                                                                   fVar139 * auVar99._0_4_)))),
                              auVar84,ZEXT1632(auVar87));
    auVar14 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar87));
    fVar222 = fVar112 * auVar13._0_4_ * 3.0;
    fVar232 = fVar112 * auVar13._4_4_ * 3.0;
    auVar20._4_4_ = fVar232;
    auVar20._0_4_ = fVar222;
    fStack_440 = fVar112 * auVar13._8_4_ * 3.0;
    auVar20._8_4_ = fStack_440;
    fStack_43c = fVar112 * auVar13._12_4_ * 3.0;
    auVar20._12_4_ = fStack_43c;
    fStack_438 = fVar112 * auVar13._16_4_ * 3.0;
    auVar20._16_4_ = fStack_438;
    fStack_434 = fVar112 * auVar13._20_4_ * 3.0;
    auVar20._20_4_ = fStack_434;
    fStack_430 = fVar112 * auVar13._24_4_ * 3.0;
    auVar20._24_4_ = fStack_430;
    auVar20._28_4_ = 0x40400000;
    local_498._0_4_ = fVar112 * auVar14._0_4_ * 3.0;
    local_498._4_4_ = fVar112 * auVar14._4_4_ * 3.0;
    fStack_490 = fVar112 * auVar14._8_4_ * 3.0;
    fStack_48c = fVar112 * auVar14._12_4_ * 3.0;
    fStack_488 = fVar112 * auVar14._16_4_ * 3.0;
    fStack_484 = fVar112 * auVar14._20_4_ * 3.0;
    fStack_480 = fVar112 * auVar14._24_4_ * 3.0;
    fStack_47c = auVar14._28_4_;
    fVar66 = auVar270._0_4_;
    fVar140 = auVar270._4_4_;
    auVar21._4_4_ = fVar140 * fVar156;
    auVar21._0_4_ = fVar66 * fVar139;
    auVar21._8_4_ = fVar66 * fVar158;
    auVar21._12_4_ = fVar140 * fVar160;
    auVar21._16_4_ = fVar66 * 0.0;
    auVar21._20_4_ = fVar140 * 0.0;
    auVar21._24_4_ = fVar66 * 0.0;
    auVar21._28_4_ = auVar13._28_4_;
    auVar270 = vfmadd231ps_fma(auVar21,auVar84,auVar175);
    fVar66 = auVar70._0_4_;
    fVar177 = auVar70._4_4_;
    auVar22._4_4_ = fVar177 * fVar156;
    auVar22._0_4_ = fVar66 * fVar139;
    auVar22._8_4_ = fVar66 * fVar158;
    auVar22._12_4_ = fVar177 * fVar160;
    auVar22._16_4_ = fVar66 * 0.0;
    auVar22._20_4_ = fVar177 * 0.0;
    auVar22._24_4_ = fVar66 * 0.0;
    auVar22._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar22,auVar84,_local_3e8);
    fVar66 = auVar8._0_4_;
    fVar177 = auVar8._4_4_;
    auVar23._4_4_ = fVar177 * fVar156;
    auVar23._0_4_ = fVar66 * fVar139;
    auVar23._8_4_ = fVar66 * fVar158;
    auVar23._12_4_ = fVar177 * fVar160;
    auVar23._16_4_ = fVar66 * 0.0;
    auVar23._20_4_ = fVar177 * 0.0;
    auVar23._24_4_ = fVar66 * 0.0;
    auVar23._28_4_ = fVar112;
    auVar8 = vfmadd231ps_fma(auVar23,auVar84,auVar136);
    fVar66 = auVar9._0_4_;
    fVar138 = auVar9._4_4_;
    auVar24._4_4_ = fVar138 * fVar156;
    auVar24._0_4_ = fVar66 * fVar139;
    auVar24._8_4_ = fVar66 * fVar158;
    auVar24._12_4_ = fVar138 * fVar160;
    auVar24._16_4_ = fVar66 * 0.0;
    auVar24._20_4_ = fVar138 * 0.0;
    auVar24._24_4_ = fVar66 * 0.0;
    auVar24._28_4_ = fVar140;
    auVar9 = vfmadd231ps_fma(auVar24,auVar84,auVar154);
    local_2f8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar203));
    fVar66 = auVar69._0_4_;
    fVar140 = auVar69._4_4_;
    auVar25._4_4_ = fVar140 * fVar156;
    auVar25._0_4_ = fVar66 * fVar139;
    auVar25._8_4_ = fVar66 * fVar158;
    auVar25._12_4_ = fVar140 * fVar160;
    auVar25._16_4_ = fVar66 * 0.0;
    auVar25._20_4_ = fVar140 * 0.0;
    auVar25._24_4_ = fVar66 * 0.0;
    auVar25._28_4_ = local_2f8._28_4_;
    auVar70 = vfmadd231ps_fma(auVar25,auVar84,auVar255);
    _local_3e8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar68));
    auVar18 = _local_3e8;
    auVar26._4_4_ = fVar156 * fStack_444;
    auVar26._0_4_ = fVar139 * local_448;
    auVar26._8_4_ = fVar158 * local_448;
    auVar26._12_4_ = fVar160 * fStack_444;
    auVar26._16_4_ = local_448 * 0.0;
    auVar26._20_4_ = fStack_444 * 0.0;
    auVar26._24_4_ = local_448 * 0.0;
    auVar26._28_4_ = fVar177;
    auVar69 = vfmadd231ps_fma(auVar26,auVar84,auVar273);
    auVar27._28_4_ = fVar140;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * auVar8._12_4_,
                            CONCAT48(fVar158 * auVar8._8_4_,
                                     CONCAT44(fVar156 * auVar8._4_4_,fVar139 * auVar8._0_4_))));
    auVar270 = vfmadd231ps_fma(auVar27,auVar84,ZEXT1632(auVar270));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar9._12_4_,
                                                 CONCAT48(fVar158 * auVar9._8_4_,
                                                          CONCAT44(fVar156 * auVar9._4_4_,
                                                                   fVar139 * auVar9._0_4_)))),
                              auVar84,ZEXT1632(auVar12));
    local_448 = auVar203._0_4_ + fVar222;
    fStack_444 = auVar203._4_4_ + fVar232;
    fStack_440 = auVar203._8_4_ + fStack_440;
    fStack_43c = auVar203._12_4_ + fStack_43c;
    fStack_438 = fStack_438 + 0.0;
    fStack_434 = fStack_434 + 0.0;
    fStack_430 = fStack_430 + 0.0;
    uStack_42c = 0x40400000;
    auVar28._28_4_ = 0x40400000;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar69._12_4_ * fVar160,
                            CONCAT48(auVar69._8_4_ * fVar158,
                                     CONCAT44(auVar69._4_4_ * fVar156,auVar69._0_4_ * fVar139))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar70._12_4_,
                                                CONCAT48(fVar158 * auVar70._8_4_,
                                                         CONCAT44(fVar156 * auVar70._4_4_,
                                                                  fVar139 * auVar70._0_4_)))),
                             auVar84,ZEXT1632(auVar8));
    auVar9 = vfmadd231ps_fma(auVar28,auVar84,ZEXT1632(auVar9));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar8._12_4_,
                                                 CONCAT48(fVar158 * auVar8._8_4_,
                                                          CONCAT44(fVar156 * auVar8._4_4_,
                                                                   fVar139 * auVar8._0_4_)))),
                              auVar84,ZEXT1632(auVar270));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar9._12_4_,
                                                 CONCAT48(fVar158 * auVar9._8_4_,
                                                          CONCAT44(fVar156 * auVar9._4_4_,
                                                                   fVar139 * auVar9._0_4_)))),
                              ZEXT1632(auVar12),auVar84);
    auVar84 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar270));
    auVar13 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
    fVar139 = fVar112 * auVar84._0_4_ * 3.0;
    fVar156 = fVar112 * auVar84._4_4_ * 3.0;
    auVar29._4_4_ = fVar156;
    auVar29._0_4_ = fVar139;
    fVar158 = fVar112 * auVar84._8_4_ * 3.0;
    auVar29._8_4_ = fVar158;
    fVar160 = fVar112 * auVar84._12_4_ * 3.0;
    auVar29._12_4_ = fVar160;
    fVar222 = fVar112 * auVar84._16_4_ * 3.0;
    auVar29._16_4_ = fVar222;
    fVar232 = fVar112 * auVar84._20_4_ * 3.0;
    auVar29._20_4_ = fVar232;
    fVar138 = fVar112 * auVar84._24_4_ * 3.0;
    auVar29._24_4_ = fVar138;
    auVar29._28_4_ = 0x40400000;
    auVar193._0_4_ = fVar112 * auVar13._0_4_ * 3.0;
    auVar193._4_4_ = fVar112 * auVar13._4_4_ * 3.0;
    auVar193._8_4_ = fVar112 * auVar13._8_4_ * 3.0;
    auVar193._12_4_ = fVar112 * auVar13._12_4_ * 3.0;
    auVar193._16_4_ = fVar112 * auVar13._16_4_ * 3.0;
    auVar193._20_4_ = fVar112 * auVar13._20_4_ * 3.0;
    auVar193._24_4_ = fVar112 * auVar13._24_4_ * 3.0;
    auVar193._28_4_ = 0;
    local_428 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar70));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar69));
    auVar84 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar203));
    auVar13 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar68));
    auVar15 = vsubps_avx(local_428,local_2f8);
    fVar155 = auVar84._0_4_ + auVar15._0_4_;
    fVar157 = auVar84._4_4_ + auVar15._4_4_;
    fVar159 = auVar84._8_4_ + auVar15._8_4_;
    fVar233 = auVar84._12_4_ + auVar15._12_4_;
    fVar245 = auVar84._16_4_ + auVar15._16_4_;
    fVar247 = auVar84._20_4_ + auVar15._20_4_;
    fVar248 = auVar84._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,_local_3e8);
    auVar265._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar265._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar265._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar265._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar265._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar265._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar265._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar265._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar112 = auVar68._0_4_;
    local_158 = fVar112 + (float)local_498._0_4_;
    fVar66 = auVar68._4_4_;
    fStack_154 = fVar66 + (float)local_498._4_4_;
    fVar140 = auVar68._8_4_;
    fStack_150 = fVar140 + fStack_490;
    fVar177 = auVar68._12_4_;
    fStack_14c = fVar177 + fStack_48c;
    fStack_148 = fStack_488 + 0.0;
    fStack_144 = fStack_484 + 0.0;
    fStack_140 = fStack_480 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar203);
    auVar13 = vsubps_avx(local_98,auVar20);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar68);
    auVar13 = vsubps_avx(local_b8,_local_498);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar70._0_4_ + fVar139;
    local_f8._4_4_ = auVar70._4_4_ + fVar156;
    local_f8._8_4_ = auVar70._8_4_ + fVar158;
    local_f8._12_4_ = auVar70._12_4_ + fVar160;
    local_f8._16_4_ = fVar222 + 0.0;
    local_f8._20_4_ = fVar232 + 0.0;
    local_f8._24_4_ = fVar138 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar256 = ZEXT1632(auVar70);
    auVar13 = vsubps_avx(auVar256,auVar29);
    _local_498 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar139 = auVar69._0_4_;
    local_138._0_4_ = fVar139 + auVar193._0_4_;
    fVar156 = auVar69._4_4_;
    local_138._4_4_ = fVar156 + auVar193._4_4_;
    fVar158 = auVar69._8_4_;
    local_138._8_4_ = fVar158 + auVar193._8_4_;
    fVar160 = auVar69._12_4_;
    local_138._12_4_ = fVar160 + auVar193._12_4_;
    local_138._16_4_ = auVar193._16_4_ + 0.0;
    local_138._20_4_ = auVar193._20_4_ + 0.0;
    local_138._24_4_ = auVar193._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar69),auVar193);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar30._4_4_ = fVar66 * fVar157;
    auVar30._0_4_ = fVar112 * fVar155;
    auVar30._8_4_ = fVar140 * fVar159;
    auVar30._12_4_ = fVar177 * fVar233;
    auVar30._16_4_ = fVar245 * 0.0;
    auVar30._20_4_ = fVar247 * 0.0;
    auVar30._24_4_ = fVar248 * 0.0;
    auVar30._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar30,local_98,auVar265);
    auVar31._4_4_ = fStack_154 * fVar157;
    auVar31._0_4_ = local_158 * fVar155;
    auVar31._8_4_ = fStack_150 * fVar159;
    auVar31._12_4_ = fStack_14c * fVar233;
    auVar31._16_4_ = fStack_148 * fVar245;
    auVar31._20_4_ = fStack_144 * fVar247;
    auVar31._24_4_ = fStack_140 * fVar248;
    auVar31._28_4_ = local_498._28_4_;
    auVar44._4_4_ = fStack_444;
    auVar44._0_4_ = local_448;
    auVar44._8_4_ = fStack_440;
    auVar44._12_4_ = fStack_43c;
    auVar44._16_4_ = fStack_438;
    auVar44._20_4_ = fStack_434;
    auVar44._24_4_ = fStack_430;
    auVar44._28_4_ = 0x40400000;
    auVar8 = vfnmadd231ps_fma(auVar31,auVar265,auVar44);
    auVar32._4_4_ = local_178._4_4_ * fVar157;
    auVar32._0_4_ = local_178._0_4_ * fVar155;
    auVar32._8_4_ = local_178._8_4_ * fVar159;
    auVar32._12_4_ = local_178._12_4_ * fVar233;
    auVar32._16_4_ = local_178._16_4_ * fVar245;
    auVar32._20_4_ = local_178._20_4_ * fVar247;
    auVar32._24_4_ = local_178._24_4_ * fVar248;
    auVar32._28_4_ = fStack_13c;
    auVar270 = vfnmadd231ps_fma(auVar32,local_d8,auVar265);
    auVar33._4_4_ = fVar157 * (float)local_3e8._4_4_;
    auVar33._0_4_ = fVar155 * (float)local_3e8._0_4_;
    auVar33._8_4_ = fVar159 * (float)uStack_3e0;
    auVar33._12_4_ = fVar233 * uStack_3e0._4_4_;
    auVar33._16_4_ = fVar245 * (float)uStack_3d8;
    auVar33._20_4_ = fVar247 * uStack_3d8._4_4_;
    auVar33._24_4_ = fVar248 * (float)uStack_3d0;
    auVar33._28_4_ = local_178._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar33,local_2f8,auVar265);
    auVar51._4_4_ = fVar156 * fVar157;
    auVar51._0_4_ = fVar139 * fVar155;
    auVar51._8_4_ = fVar158 * fVar159;
    auVar51._12_4_ = fVar160 * fVar233;
    auVar51._16_4_ = fVar245 * 0.0;
    auVar51._20_4_ = fVar247 * 0.0;
    auVar51._24_4_ = fVar248 * 0.0;
    auVar51._28_4_ = DAT_0205d4a0._28_4_;
    auVar70 = vfnmadd231ps_fma(auVar51,auVar256,auVar265);
    auVar34._4_4_ = local_138._4_4_ * fVar157;
    auVar34._0_4_ = local_138._0_4_ * fVar155;
    auVar34._8_4_ = local_138._8_4_ * fVar159;
    auVar34._12_4_ = local_138._12_4_ * fVar233;
    auVar34._16_4_ = local_138._16_4_ * fVar245;
    auVar34._20_4_ = local_138._20_4_ * fVar247;
    auVar34._24_4_ = local_138._24_4_ * fVar248;
    auVar34._28_4_ = local_2f8._28_4_;
    auVar99 = vfnmadd231ps_fma(auVar34,local_f8,auVar265);
    auVar35._4_4_ = local_118._4_4_ * fVar157;
    auVar35._0_4_ = local_118._0_4_ * fVar155;
    auVar35._8_4_ = local_118._8_4_ * fVar159;
    auVar35._12_4_ = local_118._12_4_ * fVar233;
    auVar35._16_4_ = local_118._16_4_ * fVar245;
    auVar35._20_4_ = local_118._20_4_ * fVar247;
    auVar35._24_4_ = local_118._24_4_ * fVar248;
    auVar35._28_4_ = local_d8._28_4_;
    auVar203 = vfnmadd231ps_fma(auVar35,auVar265,_local_498);
    auVar36._4_4_ = local_78._4_4_ * fVar157;
    auVar36._0_4_ = local_78._0_4_ * fVar155;
    auVar36._8_4_ = local_78._8_4_ * fVar159;
    auVar36._12_4_ = local_78._12_4_ * fVar233;
    auVar36._16_4_ = local_78._16_4_ * fVar245;
    auVar36._20_4_ = local_78._20_4_ * fVar247;
    auVar36._24_4_ = local_78._24_4_ * fVar248;
    auVar36._28_4_ = auVar84._28_4_ + auVar15._28_4_;
    auVar68 = vfnmadd231ps_fma(auVar36,auVar265,local_428);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar84 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar270),ZEXT1632(auVar9));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar270),ZEXT1632(auVar9));
    auVar84 = vmaxps_avx(auVar84,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar99));
    auVar13 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar99));
    auVar16 = vminps_avx(ZEXT1632(auVar203),ZEXT1632(auVar68));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar203),ZEXT1632(auVar68));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar84,auVar13);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar84 = vcmpps_avx(auVar15,auVar50,2);
    auVar49._4_4_ = uStack_1b4;
    auVar49._0_4_ = local_1b8;
    auVar49._8_4_ = uStack_1b0;
    auVar49._12_4_ = uStack_1ac;
    auVar49._16_4_ = uStack_1a8;
    auVar49._20_4_ = uStack_1a4;
    auVar49._24_4_ = uStack_1a0;
    auVar49._28_4_ = uStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar49,5);
    auVar84 = vandps_avx(auVar13,auVar84);
    auVar13 = local_1f8 & auVar84;
    uVar53 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_2f8,local_98);
      auVar14 = vsubps_avx(local_428,auVar256);
      fVar232 = auVar13._0_4_ + auVar14._0_4_;
      fVar138 = auVar13._4_4_ + auVar14._4_4_;
      fVar155 = auVar13._8_4_ + auVar14._8_4_;
      fVar157 = auVar13._12_4_ + auVar14._12_4_;
      fVar159 = auVar13._16_4_ + auVar14._16_4_;
      fVar233 = auVar13._20_4_ + auVar14._20_4_;
      fVar245 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_3e8,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar69));
      auVar98._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar98._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar98._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar98._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar98._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar98._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar98._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar222 = auVar16._28_4_;
      auVar98._28_4_ = auVar15._28_4_ + fVar222;
      auVar274._0_4_ = fVar112 * fVar232;
      auVar274._4_4_ = fVar66 * fVar138;
      auVar274._8_4_ = fVar140 * fVar155;
      auVar274._12_4_ = fVar177 * fVar157;
      auVar274._16_4_ = fVar159 * 0.0;
      auVar274._20_4_ = fVar233 * 0.0;
      auVar274._24_4_ = fVar245 * 0.0;
      auVar274._28_4_ = 0;
      auVar70 = vfnmadd231ps_fma(auVar274,auVar98,local_98);
      auVar37._4_4_ = fVar138 * fStack_154;
      auVar37._0_4_ = fVar232 * local_158;
      auVar37._8_4_ = fVar155 * fStack_150;
      auVar37._12_4_ = fVar157 * fStack_14c;
      auVar37._16_4_ = fVar159 * fStack_148;
      auVar37._20_4_ = fVar233 * fStack_144;
      auVar37._24_4_ = fVar245 * fStack_140;
      auVar37._28_4_ = fVar222;
      auVar45._4_4_ = fStack_444;
      auVar45._0_4_ = local_448;
      auVar45._8_4_ = fStack_440;
      auVar45._12_4_ = fStack_43c;
      auVar45._16_4_ = fStack_438;
      auVar45._20_4_ = fStack_434;
      auVar45._24_4_ = fStack_430;
      auVar45._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar45,auVar98,auVar37);
      auVar38._4_4_ = fVar138 * local_178._4_4_;
      auVar38._0_4_ = fVar232 * local_178._0_4_;
      auVar38._8_4_ = fVar155 * local_178._8_4_;
      auVar38._12_4_ = fVar157 * local_178._12_4_;
      auVar38._16_4_ = fVar159 * local_178._16_4_;
      auVar38._20_4_ = fVar233 * local_178._20_4_;
      auVar38._24_4_ = fVar245 * local_178._24_4_;
      auVar38._28_4_ = fVar222;
      auVar8 = vfnmadd213ps_fma(local_d8,auVar98,auVar38);
      auVar39._4_4_ = (float)local_3e8._4_4_ * fVar138;
      auVar39._0_4_ = (float)local_3e8._0_4_ * fVar232;
      auVar39._8_4_ = (float)uStack_3e0 * fVar155;
      auVar39._12_4_ = uStack_3e0._4_4_ * fVar157;
      auVar39._16_4_ = (float)uStack_3d8 * fVar159;
      auVar39._20_4_ = uStack_3d8._4_4_ * fVar233;
      auVar39._24_4_ = (float)uStack_3d0 * fVar245;
      auVar39._28_4_ = fVar222;
      auVar69 = vfnmadd231ps_fma(auVar39,auVar98,local_2f8);
      auVar110._0_4_ = fVar139 * fVar232;
      auVar110._4_4_ = fVar156 * fVar138;
      auVar110._8_4_ = fVar158 * fVar155;
      auVar110._12_4_ = fVar160 * fVar157;
      auVar110._16_4_ = fVar159 * 0.0;
      auVar110._20_4_ = fVar233 * 0.0;
      auVar110._24_4_ = fVar245 * 0.0;
      auVar110._28_4_ = 0;
      auVar99 = vfnmadd231ps_fma(auVar110,auVar98,auVar256);
      auVar40._4_4_ = fVar138 * local_138._4_4_;
      auVar40._0_4_ = fVar232 * local_138._0_4_;
      auVar40._8_4_ = fVar155 * local_138._8_4_;
      auVar40._12_4_ = fVar157 * local_138._12_4_;
      auVar40._16_4_ = fVar159 * local_138._16_4_;
      auVar40._20_4_ = fVar233 * local_138._20_4_;
      auVar40._24_4_ = fVar245 * local_138._24_4_;
      auVar40._28_4_ = local_3e8._28_4_;
      auVar270 = vfnmadd213ps_fma(local_f8,auVar98,auVar40);
      auVar41._4_4_ = fVar138 * local_118._4_4_;
      auVar41._0_4_ = fVar232 * local_118._0_4_;
      auVar41._8_4_ = fVar155 * local_118._8_4_;
      auVar41._12_4_ = fVar157 * local_118._12_4_;
      auVar41._16_4_ = fVar159 * local_118._16_4_;
      auVar41._20_4_ = fVar233 * local_118._20_4_;
      auVar41._24_4_ = fVar245 * local_118._24_4_;
      auVar41._28_4_ = local_3e8._28_4_;
      auVar9 = vfnmadd213ps_fma(_local_498,auVar98,auVar41);
      auVar42._4_4_ = local_78._4_4_ * fVar138;
      auVar42._0_4_ = local_78._0_4_ * fVar232;
      auVar42._8_4_ = local_78._8_4_ * fVar155;
      auVar42._12_4_ = local_78._12_4_ * fVar157;
      auVar42._16_4_ = local_78._16_4_ * fVar159;
      auVar42._20_4_ = local_78._20_4_ * fVar233;
      auVar42._24_4_ = local_78._24_4_ * fVar245;
      auVar42._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar203 = vfnmadd231ps_fma(auVar42,auVar98,local_428);
      auVar14 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar69));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar69));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar99),ZEXT1632(auVar270));
      auVar14 = vmaxps_avx(ZEXT1632(auVar99),ZEXT1632(auVar270));
      auVar256 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar203));
      auVar16 = vminps_avx(auVar16,auVar256);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar203));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar50,2);
      auVar14 = vcmpps_avx(auVar14,auVar49,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar84 = vandps_avx(auVar84,local_1f8);
      auVar14 = auVar84 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar13,auVar84);
        uVar53 = vmovmskps_avx(auVar84);
      }
    }
    if (uVar53 != 0) {
      auStack_2d8[uVar56] = uVar53;
      uVar161 = vmovlps_avx(local_248);
      *(undefined8 *)(&uStack_1d8 + uVar56 * 2) = uVar161;
      uVar61 = vmovlps_avx(local_4b8);
      auStack_58[uVar56] = uVar61;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    auVar279 = ZEXT1664(local_4c8);
    auVar266 = ZEXT1664(local_4d8);
    auVar194 = ZEXT1664(local_4e8);
    _local_3e8 = auVar18;
    do {
      auVar170 = auVar194._0_16_;
      if ((int)uVar56 == 0) {
        fVar139 = (pRVar62->super_RayK<1>).tfar;
        auVar83._4_4_ = fVar139;
        auVar83._0_4_ = fVar139;
        auVar83._8_4_ = fVar139;
        auVar83._12_4_ = fVar139;
        auVar12 = vcmpps_avx(local_298,auVar83,2);
        uVar55 = vmovmskps_avx(auVar12);
        uVar52 = uVar52 & SUB84(auVar63,0) & uVar55;
        if (uVar52 == 0) {
          return;
        }
        goto LAB_016a5ac0;
      }
      uVar54 = (int)uVar56 - 1;
      uVar57 = (ulong)uVar54;
      uVar60 = auStack_2d8[uVar57];
      uVar53 = (&uStack_1d8)[uVar57 * 2];
      fVar139 = afStack_1d4[uVar57 * 2];
      iVar17 = 0;
      for (uVar61 = (ulong)uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        iVar17 = iVar17 + 1;
      }
      uVar60 = uVar60 - 1 & uVar60;
      if (uVar60 == 0) {
        uVar56 = (ulong)uVar54;
      }
      local_4b8._8_8_ = 0;
      local_4b8._0_8_ = auStack_58[uVar57];
      auStack_2d8[uVar57] = uVar60;
      fVar156 = (float)(iVar17 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * (float)iVar17 * 0.14285715)),
                                ZEXT416(uVar53),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar156)),ZEXT416(uVar53),
                               ZEXT416((uint)(1.0 - fVar156)));
      fVar156 = auVar12._0_4_;
      local_448 = auVar8._0_4_;
      fVar139 = local_448 - fVar156;
      local_428._0_16_ = auVar12;
      fStack_444 = auVar8._4_4_;
      fStack_440 = auVar8._8_4_;
      fStack_43c = auVar8._12_4_;
      if (0.16666667 <= fVar139) break;
      auVar270 = vshufps_avx(local_4b8,local_4b8,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar9 = vsubps_avx(auVar101,auVar270);
      fVar158 = auVar270._0_4_;
      auVar116._0_4_ = fVar234 * fVar158;
      fVar160 = auVar270._4_4_;
      auVar116._4_4_ = fVar246 * fVar160;
      fVar112 = auVar270._8_4_;
      auVar116._8_4_ = fVar234 * fVar112;
      fVar66 = auVar270._12_4_;
      auVar116._12_4_ = fVar246 * fVar66;
      auVar127._0_4_ = fVar64 * fVar158;
      auVar127._4_4_ = fVar85 * fVar160;
      auVar127._8_4_ = fVar64 * fVar112;
      auVar127._12_4_ = fVar85 * fVar66;
      auVar147._0_4_ = auVar266._0_4_ * fVar158;
      auVar147._4_4_ = auVar266._4_4_ * fVar160;
      auVar147._8_4_ = auVar266._8_4_ * fVar112;
      auVar147._12_4_ = auVar266._12_4_ * fVar66;
      auVar90._0_4_ = auVar194._0_4_ * fVar158;
      auVar90._4_4_ = auVar194._4_4_ * fVar160;
      auVar90._8_4_ = auVar194._8_4_ * fVar112;
      auVar90._12_4_ = auVar194._12_4_ * fVar66;
      auVar270 = vfmadd231ps_fma(auVar116,auVar9,auVar279._0_16_);
      auVar70 = vfmadd231ps_fma(auVar127,auVar9,auVar200);
      auVar69 = vfmadd231ps_fma(auVar147,auVar9,auVar89);
      auVar9 = vfmadd231ps_fma(auVar90,auVar100,auVar9);
      auVar111._16_16_ = auVar270;
      auVar111._0_16_ = auVar270;
      auVar123._16_16_ = auVar70;
      auVar123._0_16_ = auVar70;
      auVar137._16_16_ = auVar69;
      auVar137._0_16_ = auVar69;
      auVar176._4_4_ = fVar156;
      auVar176._0_4_ = fVar156;
      auVar176._8_4_ = fVar156;
      auVar176._12_4_ = fVar156;
      auVar176._20_4_ = local_448;
      auVar176._16_4_ = local_448;
      auVar176._24_4_ = local_448;
      auVar176._28_4_ = local_448;
      auVar84 = vsubps_avx(auVar123,auVar111);
      auVar70 = vfmadd213ps_fma(auVar84,auVar176,auVar111);
      auVar84 = vsubps_avx(auVar137,auVar123);
      auVar99 = vfmadd213ps_fma(auVar84,auVar176,auVar123);
      auVar270 = vsubps_avx(auVar9,auVar69);
      auVar124._16_16_ = auVar270;
      auVar124._0_16_ = auVar270;
      auVar270 = vfmadd213ps_fma(auVar124,auVar176,auVar137);
      auVar84 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar70));
      auVar9 = vfmadd213ps_fma(auVar84,auVar176,ZEXT1632(auVar70));
      auVar84 = vsubps_avx(ZEXT1632(auVar270),ZEXT1632(auVar99));
      auVar270 = vfmadd213ps_fma(auVar84,auVar176,ZEXT1632(auVar99));
      auVar84 = vsubps_avx(ZEXT1632(auVar270),ZEXT1632(auVar9));
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar84,auVar176);
      fVar177 = auVar84._4_4_ * 3.0;
      fVar140 = fVar139 * 0.33333334;
      auVar226._0_8_ =
           CONCAT44(auVar87._4_4_ + fVar140 * fVar177,auVar87._0_4_ + fVar140 * auVar84._0_4_ * 3.0)
      ;
      auVar226._8_4_ = auVar87._8_4_ + fVar140 * auVar84._8_4_ * 3.0;
      auVar226._12_4_ = auVar87._12_4_ + fVar140 * auVar84._12_4_ * 3.0;
      auVar9 = vshufpd_avx(auVar87,auVar87,3);
      auVar70 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_498 = auVar9;
      auVar13 = _local_498;
      auVar270 = vsubps_avx(auVar9,auVar87);
      _local_3e8 = auVar70;
      auVar69 = vsubps_avx(auVar70,(undefined1  [16])0x0);
      auVar102._0_4_ = auVar270._0_4_ + auVar69._0_4_;
      auVar102._4_4_ = auVar270._4_4_ + auVar69._4_4_;
      auVar102._8_4_ = auVar270._8_4_ + auVar69._8_4_;
      auVar102._12_4_ = auVar270._12_4_ + auVar69._12_4_;
      auVar270 = vshufps_avx(auVar87,auVar87,0xb1);
      auVar69 = vshufps_avx(auVar226,auVar226,0xb1);
      auVar258._4_4_ = auVar102._0_4_;
      auVar258._0_4_ = auVar102._0_4_;
      auVar258._8_4_ = auVar102._0_4_;
      auVar258._12_4_ = auVar102._0_4_;
      auVar99 = vshufps_avx(auVar102,auVar102,0x55);
      fVar158 = auVar99._0_4_;
      auVar183._0_4_ = auVar270._0_4_ * fVar158;
      fVar160 = auVar99._4_4_;
      auVar183._4_4_ = auVar270._4_4_ * fVar160;
      fVar112 = auVar99._8_4_;
      auVar183._8_4_ = auVar270._8_4_ * fVar112;
      fVar66 = auVar99._12_4_;
      auVar183._12_4_ = auVar270._12_4_ * fVar66;
      auVar201._0_4_ = auVar69._0_4_ * fVar158;
      auVar201._4_4_ = auVar69._4_4_ * fVar160;
      auVar201._8_4_ = auVar69._8_4_ * fVar112;
      auVar201._12_4_ = auVar69._12_4_ * fVar66;
      auVar203 = vfmadd231ps_fma(auVar183,auVar258,auVar87);
      local_2f8._0_16_ = auVar226;
      auVar68 = vfmadd231ps_fma(auVar201,auVar258,auVar226);
      auVar69 = vshufps_avx(auVar203,auVar203,0xe8);
      auVar99 = vshufps_avx(auVar68,auVar68,0xe8);
      auVar270 = vcmpps_avx(auVar69,auVar99,1);
      uVar53 = vextractps_avx(auVar270,0);
      auVar113 = auVar68;
      if ((uVar53 & 1) == 0) {
        auVar113 = auVar203;
      }
      auVar128._0_4_ = fVar140 * auVar84._16_4_ * 3.0;
      auVar128._4_4_ = fVar140 * fVar177;
      auVar128._8_4_ = fVar140 * auVar84._24_4_ * 3.0;
      auVar128._12_4_ = fVar140 * local_448;
      auVar125 = vsubps_avx((undefined1  [16])0x0,auVar128);
      auVar129 = vshufps_avx(auVar125,auVar125,0xb1);
      auVar67 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar275._0_4_ = auVar129._0_4_ * fVar158;
      auVar275._4_4_ = auVar129._4_4_ * fVar160;
      auVar275._8_4_ = auVar129._8_4_ * fVar112;
      auVar275._12_4_ = auVar129._12_4_ * fVar66;
      auVar103._0_4_ = auVar67._0_4_ * fVar158;
      auVar103._4_4_ = auVar67._4_4_ * fVar160;
      auVar103._8_4_ = auVar67._8_4_ * fVar112;
      auVar103._12_4_ = auVar67._12_4_ * fVar66;
      auVar141 = vfmadd231ps_fma(auVar275,auVar258,auVar125);
      auVar142 = vfmadd231ps_fma(auVar103,(undefined1  [16])0x0,auVar258);
      auVar67 = vshufps_avx(auVar141,auVar141,0xe8);
      auVar86 = vshufps_avx(auVar142,auVar142,0xe8);
      auVar129 = vcmpps_avx(auVar67,auVar86,1);
      uVar53 = vextractps_avx(auVar129,0);
      auVar143 = auVar142;
      if ((uVar53 & 1) == 0) {
        auVar143 = auVar141;
      }
      auVar113 = vmaxss_avx(auVar143,auVar113);
      auVar69 = vminps_avx(auVar69,auVar99);
      auVar99 = vminps_avx(auVar67,auVar86);
      auVar99 = vminps_avx(auVar69,auVar99);
      auVar270 = vshufps_avx(auVar270,auVar270,0x55);
      auVar270 = vblendps_avx(auVar270,auVar129,2);
      auVar129 = vpslld_avx(auVar270,0x1f);
      auVar270 = vshufpd_avx(auVar68,auVar68,1);
      auVar270 = vinsertps_avx(auVar270,auVar142,0x9c);
      auVar69 = vshufpd_avx(auVar203,auVar203,1);
      auVar69 = vinsertps_avx(auVar69,auVar141,0x9c);
      auVar270 = vblendvps_avx(auVar69,auVar270,auVar129);
      auVar69 = vmovshdup_avx(auVar270);
      auVar270 = vmaxss_avx(auVar69,auVar270);
      fVar112 = auVar99._0_4_;
      auVar69 = vmovshdup_avx(auVar99);
      fVar160 = auVar270._0_4_;
      fVar158 = auVar113._0_4_;
      _local_498 = auVar13;
      if ((0.0001 <= fVar112) || (fVar160 <= -0.0001)) {
        auVar203 = vcmpps_avx(auVar69,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar68 = vcmpps_avx(auVar99,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar203 = vorps_avx(auVar68,auVar203);
        if ((-0.0001 < fVar158 & auVar203[0]) != 0) goto LAB_016a6ae6;
        auVar203 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar270,5);
        auVar68 = vcmpps_avx(auVar69,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar203 = vorps_avx(auVar68,auVar203);
        if ((auVar203 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016a6ae6;
LAB_016a75bf:
        bVar43 = true;
      }
      else {
LAB_016a6ae6:
        auVar68 = vcmpps_avx(auVar99,_DAT_01feba10,1);
        auVar129 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar203 = vcmpss_avx(auVar113,ZEXT816(0) << 0x20,1);
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = &DAT_3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        auVar202._8_4_ = 0xbf800000;
        auVar202._0_8_ = 0xbf800000bf800000;
        auVar202._12_4_ = 0xbf800000;
        auVar203 = vblendvps_avx(auVar148,auVar202,auVar203);
        auVar68 = vblendvps_avx(auVar148,auVar202,auVar68);
        fVar66 = auVar68._0_4_;
        fVar140 = auVar203._0_4_;
        auVar203 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar67 = ZEXT816(0) << 0x20;
        if ((fVar66 == fVar140) && (!NAN(fVar66) && !NAN(fVar140))) {
          auVar203 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar66 == fVar140) && (!NAN(fVar66) && !NAN(fVar140))) {
          auVar129 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar68 = vmovshdup_avx(auVar68);
        fVar177 = auVar68._0_4_;
        if ((fVar66 != fVar177) || (NAN(fVar66) || NAN(fVar177))) {
          fVar66 = auVar69._0_4_;
          if ((fVar66 != fVar112) || (NAN(fVar66) || NAN(fVar112))) {
            auVar104._0_4_ = (float)((uint)fVar112 ^ local_348);
            auVar104._4_4_ = auVar99._4_4_ ^ uStack_344;
            auVar104._8_4_ = auVar99._8_4_ ^ uStack_340;
            auVar104._12_4_ = auVar99._12_4_ ^ uStack_33c;
            auVar130._0_4_ = auVar104._0_4_ / (fVar66 - fVar112);
            auVar130._4_12_ = auVar104._4_12_;
            auVar69 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar67,auVar130);
            auVar99 = auVar69;
          }
          else {
            auVar69 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar112 == 0.0) && (auVar69 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar112))) {
              auVar69 = ZEXT816(0);
            }
            auVar99 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar112 == 0.0) && (auVar99 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar112))) {
              auVar99 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar203 = vminss_avx(auVar203,auVar69);
          auVar129 = vmaxss_avx(auVar99,auVar129);
        }
        auVar270 = vcmpss_avx(auVar270,auVar67,1);
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = &DAT_3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar149._8_4_ = 0xbf800000;
        auVar149._0_8_ = 0xbf800000bf800000;
        auVar149._12_4_ = 0xbf800000;
        auVar270 = vblendvps_avx(auVar131,auVar149,auVar270);
        fVar112 = auVar270._0_4_;
        auVar270 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar140 != fVar112) || (NAN(fVar140) || NAN(fVar112))) {
          if ((fVar160 != fVar158) || (NAN(fVar160) || NAN(fVar158))) {
            auVar105._0_4_ = (float)((uint)fVar158 ^ local_348);
            auVar105._4_4_ = auVar113._4_4_ ^ uStack_344;
            auVar105._8_4_ = auVar113._8_4_ ^ uStack_340;
            auVar105._12_4_ = auVar113._12_4_ ^ uStack_33c;
            auVar132._0_4_ = auVar105._0_4_ / (fVar160 - fVar158);
            auVar132._4_12_ = auVar105._4_12_;
            auVar69 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar67,auVar132);
            auVar99 = auVar69;
          }
          else {
            auVar69 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar158 == 0.0) && (auVar69 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar158))) {
              auVar69 = ZEXT816(0);
            }
            auVar99 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar158 == 0.0) && (auVar99 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar158))) {
              auVar99 = auVar270;
            }
          }
          auVar203 = vminss_avx(auVar203,auVar69);
          auVar129 = vmaxss_avx(auVar99,auVar129);
        }
        if ((fVar177 != fVar112) || (NAN(fVar177) || NAN(fVar112))) {
          auVar203 = vminss_avx(auVar203,auVar270);
          auVar129 = vmaxss_avx(auVar270,auVar129);
        }
        auVar69 = vmaxss_avx(auVar67,auVar203);
        auVar99 = vminss_avx(auVar129,auVar270);
        bVar43 = true;
        if (auVar69._0_4_ <= auVar99._0_4_) {
          auVar69 = vmaxss_avx(auVar67,ZEXT416((uint)(auVar69._0_4_ + -0.1)));
          auVar270 = vminss_avx(ZEXT416((uint)(auVar99._0_4_ + 0.1)),auVar270);
          auVar91._0_8_ = auVar87._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar204._8_8_ = auVar226._0_8_;
          auVar204._0_8_ = auVar226._0_8_;
          auVar217._8_8_ = auVar125._0_8_;
          auVar217._0_8_ = auVar125._0_8_;
          auVar99 = vshufpd_avx(auVar226,auVar226,3);
          auVar203 = vshufpd_avx(auVar125,auVar125,3);
          auVar68 = vshufps_avx(auVar69,auVar270,0);
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = &DAT_3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          auVar87 = vsubps_avx(auVar117,auVar68);
          local_498._0_4_ = auVar9._0_4_;
          local_498._4_4_ = auVar9._4_4_;
          fStack_490 = auVar9._8_4_;
          fStack_48c = auVar9._12_4_;
          fVar158 = auVar68._0_4_;
          auVar118._0_4_ = fVar158 * (float)local_498._0_4_;
          fVar160 = auVar68._4_4_;
          auVar118._4_4_ = fVar160 * (float)local_498._4_4_;
          fVar112 = auVar68._8_4_;
          auVar118._8_4_ = fVar112 * fStack_490;
          fVar66 = auVar68._12_4_;
          auVar118._12_4_ = fVar66 * fStack_48c;
          auVar133._0_4_ = auVar99._0_4_ * fVar158;
          auVar133._4_4_ = auVar99._4_4_ * fVar160;
          auVar133._8_4_ = auVar99._8_4_ * fVar112;
          auVar133._12_4_ = auVar99._12_4_ * fVar66;
          auVar150._0_4_ = auVar203._0_4_ * fVar158;
          auVar150._4_4_ = auVar203._4_4_ * fVar160;
          auVar150._8_4_ = auVar203._8_4_ * fVar112;
          auVar150._12_4_ = auVar203._12_4_ * fVar66;
          local_3e8._0_4_ = auVar70._0_4_;
          local_3e8._4_4_ = auVar70._4_4_;
          uStack_3e0._0_4_ = auVar70._8_4_;
          uStack_3e0._4_4_ = auVar70._12_4_;
          auVar171._0_4_ = fVar158 * (float)local_3e8._0_4_;
          auVar171._4_4_ = fVar160 * (float)local_3e8._4_4_;
          auVar171._8_4_ = fVar112 * (float)uStack_3e0;
          auVar171._12_4_ = fVar66 * uStack_3e0._4_4_;
          auVar99 = vfmadd231ps_fma(auVar118,auVar87,auVar91);
          auVar203 = vfmadd231ps_fma(auVar133,auVar87,auVar204);
          auVar68 = vfmadd231ps_fma(auVar150,auVar87,auVar217);
          auVar87 = vfmadd231ps_fma(auVar171,auVar87,ZEXT816(0));
          auVar9 = vmovshdup_avx(local_4b8);
          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar69._0_4_)),local_4b8,
                                     ZEXT416((uint)(1.0 - auVar69._0_4_)));
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar270._0_4_)),local_4b8,
                                    ZEXT416((uint)(1.0 - auVar270._0_4_)));
          fVar158 = 1.0 / fVar139;
          auVar270 = vsubps_avx(auVar203,auVar99);
          auVar184._0_4_ = auVar270._0_4_ * 3.0;
          auVar184._4_4_ = auVar270._4_4_ * 3.0;
          auVar184._8_4_ = auVar270._8_4_ * 3.0;
          auVar184._12_4_ = auVar270._12_4_ * 3.0;
          auVar270 = vsubps_avx(auVar68,auVar203);
          auVar205._0_4_ = auVar270._0_4_ * 3.0;
          auVar205._4_4_ = auVar270._4_4_ * 3.0;
          auVar205._8_4_ = auVar270._8_4_ * 3.0;
          auVar205._12_4_ = auVar270._12_4_ * 3.0;
          auVar270 = vsubps_avx(auVar87,auVar68);
          auVar218._0_4_ = auVar270._0_4_ * 3.0;
          auVar218._4_4_ = auVar270._4_4_ * 3.0;
          auVar218._8_4_ = auVar270._8_4_ * 3.0;
          auVar218._12_4_ = auVar270._12_4_ * 3.0;
          auVar9 = vminps_avx(auVar205,auVar218);
          auVar270 = vmaxps_avx(auVar205,auVar218);
          auVar9 = vminps_avx(auVar184,auVar9);
          auVar270 = vmaxps_avx(auVar184,auVar270);
          auVar70 = vshufpd_avx(auVar9,auVar9,3);
          auVar69 = vshufpd_avx(auVar270,auVar270,3);
          auVar9 = vminps_avx(auVar9,auVar70);
          auVar270 = vmaxps_avx(auVar270,auVar69);
          auVar206._0_4_ = auVar9._0_4_ * fVar158;
          auVar206._4_4_ = auVar9._4_4_ * fVar158;
          auVar206._8_4_ = auVar9._8_4_ * fVar158;
          auVar206._12_4_ = auVar9._12_4_ * fVar158;
          auVar185._0_4_ = fVar158 * auVar270._0_4_;
          auVar185._4_4_ = fVar158 * auVar270._4_4_;
          auVar185._8_4_ = fVar158 * auVar270._8_4_;
          auVar185._12_4_ = fVar158 * auVar270._12_4_;
          fVar158 = 1.0 / (auVar67._0_4_ - auVar129._0_4_);
          auVar270 = vshufpd_avx(auVar99,auVar99,3);
          auVar9 = vshufpd_avx(auVar203,auVar203,3);
          auVar70 = vshufpd_avx(auVar68,auVar68,3);
          auVar69 = vshufpd_avx(auVar87,auVar87,3);
          auVar270 = vsubps_avx(auVar270,auVar99);
          auVar99 = vsubps_avx(auVar9,auVar203);
          auVar203 = vsubps_avx(auVar70,auVar68);
          auVar69 = vsubps_avx(auVar69,auVar87);
          auVar9 = vminps_avx(auVar270,auVar99);
          auVar270 = vmaxps_avx(auVar270,auVar99);
          auVar70 = vminps_avx(auVar203,auVar69);
          auVar70 = vminps_avx(auVar9,auVar70);
          auVar9 = vmaxps_avx(auVar203,auVar69);
          auVar270 = vmaxps_avx(auVar270,auVar9);
          auVar238._0_4_ = fVar158 * auVar70._0_4_;
          auVar238._4_4_ = fVar158 * auVar70._4_4_;
          auVar238._8_4_ = fVar158 * auVar70._8_4_;
          auVar238._12_4_ = fVar158 * auVar70._12_4_;
          auVar227._0_4_ = fVar158 * auVar270._0_4_;
          auVar227._4_4_ = fVar158 * auVar270._4_4_;
          auVar227._8_4_ = fVar158 * auVar270._8_4_;
          auVar227._12_4_ = fVar158 * auVar270._12_4_;
          auVar70 = vinsertps_avx(auVar12,auVar129,0x10);
          auVar69 = vinsertps_avx(auVar8,auVar67,0x10);
          auVar82._0_4_ = (auVar70._0_4_ + auVar69._0_4_) * 0.5;
          auVar82._4_4_ = (auVar70._4_4_ + auVar69._4_4_) * 0.5;
          auVar82._8_4_ = (auVar70._8_4_ + auVar69._8_4_) * 0.5;
          auVar82._12_4_ = (auVar70._12_4_ + auVar69._12_4_) * 0.5;
          auVar119._4_4_ = auVar82._0_4_;
          auVar119._0_4_ = auVar82._0_4_;
          auVar119._8_4_ = auVar82._0_4_;
          auVar119._12_4_ = auVar82._0_4_;
          auVar8 = vfmadd213ps_fma(local_208,auVar119,local_458);
          auVar270 = vfmadd213ps_fma(local_218,auVar119,local_468);
          auVar9 = vfmadd213ps_fma(local_228,auVar119,local_478);
          auVar12 = vsubps_avx(auVar270,auVar8);
          auVar8 = vfmadd213ps_fma(auVar12,auVar119,auVar8);
          auVar12 = vsubps_avx(auVar9,auVar270);
          auVar12 = vfmadd213ps_fma(auVar12,auVar119,auVar270);
          auVar12 = vsubps_avx(auVar12,auVar8);
          auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar119);
          auVar120._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
          auVar120._8_4_ = auVar12._8_4_ * 3.0;
          auVar120._12_4_ = auVar12._12_4_ * 3.0;
          auVar219._8_8_ = auVar8._0_8_;
          auVar219._0_8_ = auVar8._0_8_;
          auVar12 = vshufpd_avx(auVar8,auVar8,3);
          auVar8 = vshufps_avx(auVar82,auVar82,0x55);
          auVar99 = vsubps_avx(auVar12,auVar219);
          auVar68 = vfmadd231ps_fma(auVar219,auVar8,auVar99);
          auVar259._8_8_ = auVar120._0_8_;
          auVar259._0_8_ = auVar120._0_8_;
          auVar12 = vshufpd_avx(auVar120,auVar120,3);
          auVar12 = vsubps_avx(auVar12,auVar259);
          auVar203 = vfmadd213ps_fma(auVar12,auVar8,auVar259);
          auVar8 = vmovshdup_avx(auVar203);
          auVar260._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
          auVar260._8_4_ = auVar8._8_4_ ^ 0x80000000;
          auVar260._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar270 = vmovshdup_avx(auVar99);
          auVar12 = vunpcklps_avx(auVar270,auVar260);
          auVar9 = vshufps_avx(auVar12,auVar260,4);
          auVar276._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
          auVar276._8_4_ = auVar99._8_4_ ^ 0x80000000;
          auVar276._12_4_ = auVar99._12_4_ ^ 0x80000000;
          auVar12 = vmovlhps_avx(auVar276,auVar203);
          auVar12 = vshufps_avx(auVar12,auVar203,8);
          auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar99._0_4_)),auVar270,auVar203);
          auVar134._0_4_ = auVar8._0_4_;
          auVar134._4_4_ = auVar134._0_4_;
          auVar134._8_4_ = auVar134._0_4_;
          auVar134._12_4_ = auVar134._0_4_;
          auVar8 = vdivps_avx(auVar9,auVar134);
          auVar270 = vdivps_avx(auVar12,auVar134);
          fVar112 = auVar68._0_4_;
          fVar158 = auVar8._0_4_;
          auVar12 = vshufps_avx(auVar68,auVar68,0x55);
          fVar160 = auVar270._0_4_;
          local_3e8._4_4_ = fVar112 * auVar8._4_4_ + auVar12._4_4_ * auVar270._4_4_;
          local_3e8._0_4_ = fVar112 * fVar158 + auVar12._0_4_ * fVar160;
          uStack_3e0._0_4_ = fVar112 * auVar8._8_4_ + auVar12._8_4_ * auVar270._8_4_;
          uStack_3e0._4_4_ = fVar112 * auVar8._12_4_ + auVar12._12_4_ * auVar270._12_4_;
          auVar99 = vmovshdup_avx(auVar8);
          auVar12 = vinsertps_avx(auVar206,auVar238,0x1c);
          auVar271._0_4_ = auVar99._0_4_ * auVar12._0_4_;
          auVar271._4_4_ = auVar99._4_4_ * auVar12._4_4_;
          auVar271._8_4_ = auVar99._8_4_ * auVar12._8_4_;
          auVar271._12_4_ = auVar99._12_4_ * auVar12._12_4_;
          auVar9 = vinsertps_avx(auVar185,auVar227,0x1c);
          auVar250._0_4_ = auVar99._0_4_ * auVar9._0_4_;
          auVar250._4_4_ = auVar99._4_4_ * auVar9._4_4_;
          auVar250._8_4_ = auVar99._8_4_ * auVar9._8_4_;
          auVar250._12_4_ = auVar99._12_4_ * auVar9._12_4_;
          auVar87 = vminps_avx(auVar271,auVar250);
          auVar68 = vmaxps_avx(auVar250,auVar271);
          auVar99 = vinsertps_avx(auVar238,auVar206,0x4c);
          auVar113 = vmovshdup_avx(auVar270);
          auVar203 = vinsertps_avx(auVar227,auVar185,0x4c);
          auVar228._0_4_ = auVar113._0_4_ * auVar99._0_4_;
          auVar228._4_4_ = auVar113._4_4_ * auVar99._4_4_;
          auVar228._8_4_ = auVar113._8_4_ * auVar99._8_4_;
          auVar228._12_4_ = auVar113._12_4_ * auVar99._12_4_;
          auVar239._0_4_ = auVar113._0_4_ * auVar203._0_4_;
          auVar239._4_4_ = auVar113._4_4_ * auVar203._4_4_;
          auVar239._8_4_ = auVar113._8_4_ * auVar203._8_4_;
          auVar239._12_4_ = auVar113._12_4_ * auVar203._12_4_;
          auVar113 = vminps_avx(auVar228,auVar239);
          auVar92._0_4_ = auVar113._0_4_ + auVar87._0_4_;
          auVar92._4_4_ = auVar113._4_4_ + auVar87._4_4_;
          auVar92._8_4_ = auVar113._8_4_ + auVar87._8_4_;
          auVar92._12_4_ = auVar113._12_4_ + auVar87._12_4_;
          auVar87 = vmaxps_avx(auVar239,auVar228);
          auVar229._0_4_ = auVar68._0_4_ + auVar87._0_4_;
          auVar229._4_4_ = auVar68._4_4_ + auVar87._4_4_;
          auVar229._8_4_ = auVar68._8_4_ + auVar87._8_4_;
          auVar229._12_4_ = auVar68._12_4_ + auVar87._12_4_;
          auVar240._8_8_ = 0x3f80000000000000;
          auVar240._0_8_ = 0x3f80000000000000;
          auVar68 = vsubps_avx(auVar240,auVar229);
          auVar87 = vsubps_avx(auVar240,auVar92);
          auVar113 = vsubps_avx(auVar70,auVar82);
          auVar261._0_4_ = fVar158 * auVar12._0_4_;
          auVar261._4_4_ = fVar158 * auVar12._4_4_;
          auVar261._8_4_ = fVar158 * auVar12._8_4_;
          auVar261._12_4_ = fVar158 * auVar12._12_4_;
          auVar251._0_4_ = fVar158 * auVar9._0_4_;
          auVar251._4_4_ = fVar158 * auVar9._4_4_;
          auVar251._8_4_ = fVar158 * auVar9._8_4_;
          auVar251._12_4_ = fVar158 * auVar9._12_4_;
          auVar9 = vminps_avx(auVar261,auVar251);
          auVar12 = vmaxps_avx(auVar251,auVar261);
          auVar207._0_4_ = fVar160 * auVar99._0_4_;
          auVar207._4_4_ = fVar160 * auVar99._4_4_;
          auVar207._8_4_ = fVar160 * auVar99._8_4_;
          auVar207._12_4_ = fVar160 * auVar99._12_4_;
          auVar186._0_4_ = fVar160 * auVar203._0_4_;
          auVar186._4_4_ = fVar160 * auVar203._4_4_;
          auVar186._8_4_ = fVar160 * auVar203._8_4_;
          auVar186._12_4_ = fVar160 * auVar203._12_4_;
          auVar99 = vminps_avx(auVar207,auVar186);
          auVar262._0_4_ = auVar9._0_4_ + auVar99._0_4_;
          auVar262._4_4_ = auVar9._4_4_ + auVar99._4_4_;
          auVar262._8_4_ = auVar9._8_4_ + auVar99._8_4_;
          auVar262._12_4_ = auVar9._12_4_ + auVar99._12_4_;
          auVar99 = vsubps_avx(auVar69,auVar82);
          auVar9 = vmaxps_avx(auVar186,auVar207);
          fVar112 = auVar113._0_4_;
          auVar208._0_4_ = fVar112 * auVar68._0_4_;
          fVar66 = auVar113._4_4_;
          auVar208._4_4_ = fVar66 * auVar68._4_4_;
          fVar140 = auVar113._8_4_;
          auVar208._8_4_ = fVar140 * auVar68._8_4_;
          fVar177 = auVar113._12_4_;
          auVar208._12_4_ = fVar177 * auVar68._12_4_;
          auVar187._0_4_ = auVar12._0_4_ + auVar9._0_4_;
          auVar187._4_4_ = auVar12._4_4_ + auVar9._4_4_;
          auVar187._8_4_ = auVar12._8_4_ + auVar9._8_4_;
          auVar187._12_4_ = auVar12._12_4_ + auVar9._12_4_;
          auVar252._8_8_ = 0x3f800000;
          auVar252._0_8_ = 0x3f800000;
          auVar12 = vsubps_avx(auVar252,auVar187);
          auVar9 = vsubps_avx(auVar252,auVar262);
          auVar263._0_4_ = fVar112 * auVar87._0_4_;
          auVar263._4_4_ = fVar66 * auVar87._4_4_;
          auVar263._8_4_ = fVar140 * auVar87._8_4_;
          auVar263._12_4_ = fVar177 * auVar87._12_4_;
          fVar222 = auVar99._0_4_;
          auVar230._0_4_ = fVar222 * auVar68._0_4_;
          fVar232 = auVar99._4_4_;
          auVar230._4_4_ = fVar232 * auVar68._4_4_;
          fVar138 = auVar99._8_4_;
          auVar230._8_4_ = fVar138 * auVar68._8_4_;
          fVar155 = auVar99._12_4_;
          auVar230._12_4_ = fVar155 * auVar68._12_4_;
          auVar93._0_4_ = fVar222 * auVar87._0_4_;
          auVar93._4_4_ = fVar232 * auVar87._4_4_;
          auVar93._8_4_ = fVar138 * auVar87._8_4_;
          auVar93._12_4_ = fVar155 * auVar87._12_4_;
          auVar277._0_4_ = fVar112 * auVar12._0_4_;
          auVar277._4_4_ = fVar66 * auVar12._4_4_;
          auVar277._8_4_ = fVar140 * auVar12._8_4_;
          auVar277._12_4_ = fVar177 * auVar12._12_4_;
          auVar241._0_4_ = fVar112 * auVar9._0_4_;
          auVar241._4_4_ = fVar66 * auVar9._4_4_;
          auVar241._8_4_ = fVar140 * auVar9._8_4_;
          auVar241._12_4_ = fVar177 * auVar9._12_4_;
          auVar188._0_4_ = fVar222 * auVar12._0_4_;
          auVar188._4_4_ = fVar232 * auVar12._4_4_;
          auVar188._8_4_ = fVar138 * auVar12._8_4_;
          auVar188._12_4_ = fVar155 * auVar12._12_4_;
          auVar253._0_4_ = fVar222 * auVar9._0_4_;
          auVar253._4_4_ = fVar232 * auVar9._4_4_;
          auVar253._8_4_ = fVar138 * auVar9._8_4_;
          auVar253._12_4_ = fVar155 * auVar9._12_4_;
          auVar12 = vminps_avx(auVar277,auVar241);
          auVar9 = vminps_avx(auVar188,auVar253);
          auVar12 = vminps_avx(auVar12,auVar9);
          auVar9 = vmaxps_avx(auVar241,auVar277);
          auVar99 = vminps_avx(auVar208,auVar263);
          auVar203 = vminps_avx(auVar230,auVar93);
          auVar99 = vminps_avx(auVar99,auVar203);
          auVar12 = vhaddps_avx(auVar12,auVar99);
          auVar99 = vmaxps_avx(auVar253,auVar188);
          auVar9 = vmaxps_avx(auVar99,auVar9);
          auVar99 = vmaxps_avx(auVar263,auVar208);
          auVar203 = vmaxps_avx(auVar93,auVar230);
          auVar99 = vmaxps_avx(auVar203,auVar99);
          auVar9 = vhaddps_avx(auVar9,auVar99);
          auVar99 = vshufps_avx(auVar82,auVar82,0x54);
          auVar99 = vsubps_avx(auVar99,_local_3e8);
          auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
          auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
          auVar209._0_4_ = auVar99._0_4_ + auVar12._0_4_;
          auVar209._4_4_ = auVar99._4_4_ + auVar12._4_4_;
          auVar209._8_4_ = auVar99._8_4_ + auVar12._8_4_;
          auVar209._12_4_ = auVar99._12_4_ + auVar12._12_4_;
          auVar189._0_4_ = auVar99._0_4_ + auVar9._0_4_;
          auVar189._4_4_ = auVar99._4_4_ + auVar9._4_4_;
          auVar189._8_4_ = auVar99._8_4_ + auVar9._8_4_;
          auVar189._12_4_ = auVar99._12_4_ + auVar9._12_4_;
          auVar12 = vmaxps_avx(auVar70,auVar209);
          auVar9 = vminps_avx(auVar189,auVar69);
          auVar12 = vcmpps_avx(auVar9,auVar12,1);
          auVar12 = vshufps_avx(auVar12,auVar12,0x50);
          local_4b8 = vinsertps_avx(auVar129,ZEXT416((uint)auVar67._0_4_),0x10);
          if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar12[0xf] < '\0') goto LAB_016a75bf;
          bVar59 = 0;
          if ((fVar156 < auVar209._0_4_) && (bVar59 = 0, auVar189._0_4_ < auVar69._0_4_)) {
            auVar9 = vmovshdup_avx(auVar209);
            auVar12 = vcmpps_avx(auVar189,auVar69,1);
            bVar59 = auVar12[4] & auVar129._0_4_ < auVar9._0_4_;
          }
          if (((3 < (uint)uVar56 || fVar139 < 0.001) | bVar59) == 1) {
            lVar58 = 200;
            do {
              fVar66 = auVar99._0_4_;
              fVar112 = 1.0 - fVar66;
              fVar139 = fVar112 * fVar112 * fVar112;
              fVar156 = fVar66 * 3.0 * fVar112 * fVar112;
              fVar112 = fVar112 * fVar66 * fVar66 * 3.0;
              auVar151._4_4_ = fVar139;
              auVar151._0_4_ = fVar139;
              auVar151._8_4_ = fVar139;
              auVar151._12_4_ = fVar139;
              auVar106._4_4_ = fVar156;
              auVar106._0_4_ = fVar156;
              auVar106._8_4_ = fVar156;
              auVar106._12_4_ = fVar156;
              auVar94._4_4_ = fVar112;
              auVar94._0_4_ = fVar112;
              auVar94._8_4_ = fVar112;
              auVar94._12_4_ = fVar112;
              fVar66 = fVar66 * fVar66 * fVar66;
              auVar172._0_4_ = (float)local_238._0_4_ * fVar66;
              auVar172._4_4_ = (float)local_238._4_4_ * fVar66;
              auVar172._8_4_ = fStack_230 * fVar66;
              auVar172._12_4_ = fStack_22c * fVar66;
              auVar12 = vfmadd231ps_fma(auVar172,local_478,auVar94);
              auVar12 = vfmadd231ps_fma(auVar12,local_468,auVar106);
              auVar12 = vfmadd231ps_fma(auVar12,local_458,auVar151);
              auVar95._8_8_ = auVar12._0_8_;
              auVar95._0_8_ = auVar12._0_8_;
              auVar12 = vshufpd_avx(auVar12,auVar12,3);
              auVar9 = vshufps_avx(auVar99,auVar99,0x55);
              auVar12 = vsubps_avx(auVar12,auVar95);
              auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar95);
              fVar139 = auVar9._0_4_;
              auVar12 = vshufps_avx(auVar9,auVar9,0x55);
              auVar96._0_4_ = fVar158 * fVar139 + fVar160 * auVar12._0_4_;
              auVar96._4_4_ = auVar8._4_4_ * fVar139 + auVar270._4_4_ * auVar12._4_4_;
              auVar96._8_4_ = auVar8._8_4_ * fVar139 + auVar270._8_4_ * auVar12._8_4_;
              auVar96._12_4_ = auVar8._12_4_ * fVar139 + auVar270._12_4_ * auVar12._12_4_;
              auVar99 = vsubps_avx(auVar99,auVar96);
              auVar12 = vandps_avx(local_338,auVar9);
              auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
              auVar12 = vmaxss_avx(auVar9,auVar12);
              if (auVar12._0_4_ < (float)local_408._0_4_) {
                fVar139 = auVar99._0_4_;
                auVar194 = ZEXT1664(local_4e8);
                if (fVar139 < 0.0) {
                  auVar279 = ZEXT1664(local_4c8);
                  auVar266 = ZEXT1664(local_4d8);
                  goto LAB_016a75a6;
                }
                auVar279 = ZEXT1664(local_4c8);
                auVar266 = ZEXT1664(local_4d8);
                if (1.0 < fVar139) goto LAB_016a75a6;
                auVar12 = vmovshdup_avx(auVar99);
                fVar156 = auVar12._0_4_;
                if ((fVar156 < 0.0) || (1.0 < fVar156)) goto LAB_016a75a6;
                auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                        ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                auVar68 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                        0x28);
                aVar1 = (pRVar62->super_RayK<1>).org.field_0;
                auVar12 = vsubps_avx(local_358,(undefined1  [16])aVar1);
                auVar12 = vdpps_avx(auVar12,auVar68,0x7f);
                auVar8 = vsubps_avx(local_388,(undefined1  [16])aVar1);
                auVar8 = vdpps_avx(auVar8,auVar68,0x7f);
                auVar270 = vsubps_avx(local_398,(undefined1  [16])aVar1);
                auVar270 = vdpps_avx(auVar270,auVar68,0x7f);
                auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar1);
                auVar9 = vdpps_avx(auVar9,auVar68,0x7f);
                auVar70 = vsubps_avx(_local_368,(undefined1  [16])aVar1);
                auVar70 = vdpps_avx(auVar70,auVar68,0x7f);
                auVar69 = vsubps_avx(_local_3a8,(undefined1  [16])aVar1);
                auVar69 = vdpps_avx(auVar69,auVar68,0x7f);
                auVar203 = vsubps_avx(_local_3b8,(undefined1  [16])aVar1);
                auVar203 = vdpps_avx(auVar203,auVar68,0x7f);
                auVar48._4_4_ = fStack_3c4;
                auVar48._0_4_ = local_3c8;
                auVar48._8_4_ = fStack_3c0;
                auVar48._12_4_ = fStack_3bc;
                auVar87 = vsubps_avx(auVar48,(undefined1  [16])aVar1);
                auVar68 = vdpps_avx(auVar87,auVar68,0x7f);
                fVar158 = 1.0 - fVar156;
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar156)),
                                          ZEXT416((uint)fVar158),auVar12);
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * fVar156)),
                                         ZEXT416((uint)fVar158),auVar8);
                auVar270 = vfmadd231ss_fma(ZEXT416((uint)(auVar203._0_4_ * fVar156)),
                                           ZEXT416((uint)fVar158),auVar270);
                auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * auVar68._0_4_)),
                                         ZEXT416((uint)fVar158),auVar9);
                fVar112 = 1.0 - fVar139;
                fVar156 = fVar112 * fVar139 * fVar139 * 3.0;
                fVar140 = fVar139 * fVar139 * fVar139;
                auVar270 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar140)),
                                           ZEXT416((uint)fVar156),auVar270);
                fVar158 = fVar139 * 3.0 * fVar112 * fVar112;
                auVar8 = vfmadd231ss_fma(auVar270,ZEXT416((uint)fVar158),auVar8);
                fVar160 = fVar112 * fVar112 * fVar112;
                auVar12 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar160),auVar12);
                fVar66 = auVar12._0_4_;
                if ((pRVar62->super_RayK<1>).org.field_0.m128[3] <= fVar66) {
                  fVar177 = (pRVar62->super_RayK<1>).tfar;
                  local_3e8._0_4_ = fVar177;
                  auVar266 = ZEXT1664(local_4d8);
                  auVar194 = ZEXT1664(local_4e8);
                  if (fVar177 < fVar66) goto LAB_016a75a6;
                  _fStack_490 = auVar13._8_24_;
                  local_498 = auVar63;
                  pGVar4 = (context->scene->geometries).items[uVar55].ptr;
                  if ((pGVar4->mask & (pRVar62->super_RayK<1>).mask) == 0) goto LAB_016a75a6;
                  auVar12 = vshufps_avx(auVar99,auVar99,0x55);
                  auVar210._8_4_ = 0x3f800000;
                  auVar210._0_8_ = &DAT_3f8000003f800000;
                  auVar210._12_4_ = 0x3f800000;
                  auVar8 = vsubps_avx(auVar210,auVar12);
                  fVar177 = auVar12._0_4_;
                  auVar220._0_4_ = fVar177 * (float)local_368._0_4_;
                  fVar222 = auVar12._4_4_;
                  auVar220._4_4_ = fVar222 * (float)local_368._4_4_;
                  fVar232 = auVar12._8_4_;
                  auVar220._8_4_ = fVar232 * fStack_360;
                  fVar138 = auVar12._12_4_;
                  auVar220._12_4_ = fVar138 * fStack_35c;
                  auVar231._0_4_ = fVar177 * (float)local_3a8._0_4_;
                  auVar231._4_4_ = fVar222 * (float)local_3a8._4_4_;
                  auVar231._8_4_ = fVar232 * fStack_3a0;
                  auVar231._12_4_ = fVar138 * fStack_39c;
                  auVar242._0_4_ = fVar177 * (float)local_3b8._0_4_;
                  auVar242._4_4_ = fVar222 * (float)local_3b8._4_4_;
                  auVar242._8_4_ = fVar232 * fStack_3b0;
                  auVar242._12_4_ = fVar138 * fStack_3ac;
                  auVar190._0_4_ = fVar177 * local_3c8;
                  auVar190._4_4_ = fVar222 * fStack_3c4;
                  auVar190._8_4_ = fVar232 * fStack_3c0;
                  auVar190._12_4_ = fVar138 * fStack_3bc;
                  auVar12 = vfmadd231ps_fma(auVar220,auVar8,local_358);
                  auVar270 = vfmadd231ps_fma(auVar231,auVar8,local_388);
                  auVar9 = vfmadd231ps_fma(auVar242,auVar8,local_398);
                  auVar70 = vfmadd231ps_fma(auVar190,auVar8,local_378);
                  auVar12 = vsubps_avx(auVar270,auVar12);
                  auVar8 = vsubps_avx(auVar9,auVar270);
                  auVar270 = vsubps_avx(auVar70,auVar9);
                  auVar243._0_4_ = fVar139 * auVar8._0_4_;
                  auVar243._4_4_ = fVar139 * auVar8._4_4_;
                  auVar243._8_4_ = fVar139 * auVar8._8_4_;
                  auVar243._12_4_ = fVar139 * auVar8._12_4_;
                  auVar173._4_4_ = fVar112;
                  auVar173._0_4_ = fVar112;
                  auVar173._8_4_ = fVar112;
                  auVar173._12_4_ = fVar112;
                  auVar12 = vfmadd231ps_fma(auVar243,auVar173,auVar12);
                  auVar191._0_4_ = fVar139 * auVar270._0_4_;
                  auVar191._4_4_ = fVar139 * auVar270._4_4_;
                  auVar191._8_4_ = fVar139 * auVar270._8_4_;
                  auVar191._12_4_ = fVar139 * auVar270._12_4_;
                  auVar8 = vfmadd231ps_fma(auVar191,auVar173,auVar8);
                  auVar192._0_4_ = fVar139 * auVar8._0_4_;
                  auVar192._4_4_ = fVar139 * auVar8._4_4_;
                  auVar192._8_4_ = fVar139 * auVar8._8_4_;
                  auVar192._12_4_ = fVar139 * auVar8._12_4_;
                  auVar8 = vfmadd231ps_fma(auVar192,auVar173,auVar12);
                  auVar152._0_4_ = fVar140 * (float)local_288._0_4_;
                  auVar152._4_4_ = fVar140 * (float)local_288._4_4_;
                  auVar152._8_4_ = fVar140 * fStack_280;
                  auVar152._12_4_ = fVar140 * fStack_27c;
                  auVar107._4_4_ = fVar156;
                  auVar107._0_4_ = fVar156;
                  auVar107._8_4_ = fVar156;
                  auVar107._12_4_ = fVar156;
                  auVar12 = vfmadd132ps_fma(auVar107,auVar152,local_278);
                  auVar135._4_4_ = fVar158;
                  auVar135._0_4_ = fVar158;
                  auVar135._8_4_ = fVar158;
                  auVar135._12_4_ = fVar158;
                  auVar12 = vfmadd132ps_fma(auVar135,auVar12,local_268);
                  auVar153._0_4_ = auVar8._0_4_ * 3.0;
                  auVar153._4_4_ = auVar8._4_4_ * 3.0;
                  auVar153._8_4_ = auVar8._8_4_ * 3.0;
                  auVar153._12_4_ = auVar8._12_4_ * 3.0;
                  auVar121._4_4_ = fVar160;
                  auVar121._0_4_ = fVar160;
                  auVar121._8_4_ = fVar160;
                  auVar121._12_4_ = fVar160;
                  auVar8 = vfmadd132ps_fma(auVar121,auVar12,local_258);
                  auVar12 = vshufps_avx(auVar153,auVar153,0xc9);
                  auVar108._0_4_ = auVar8._0_4_ * auVar12._0_4_;
                  auVar108._4_4_ = auVar8._4_4_ * auVar12._4_4_;
                  auVar108._8_4_ = auVar8._8_4_ * auVar12._8_4_;
                  auVar108._12_4_ = auVar8._12_4_ * auVar12._12_4_;
                  auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
                  auVar12 = vfmsub231ps_fma(auVar108,auVar153,auVar12);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar8 = vshufps_avx(auVar12,auVar12,0xe9);
                    local_2c8 = vmovlps_avx(auVar8);
                    local_2c0 = auVar12._0_4_;
                    local_2bc = vmovlps_avx(auVar99);
                    local_2b4 = (uint)local_3f0;
                    local_2b0 = uVar55;
                    local_2ac = context->user->instID[0];
                    local_2a8 = context->user->instPrimID[0];
                    (pRVar62->super_RayK<1>).tfar = fVar66;
                    local_4ec = -1;
                    local_328.valid = &local_4ec;
                    local_328.geometryUserPtr = pGVar4->userPtr;
                    local_328.context = context->user;
                    local_328.ray = (RTCRayN *)pRVar62;
                    local_328.hit = (RTCHitN *)&local_2c8;
                    local_328.N = 1;
                    auVar194 = ZEXT1664(local_4e8);
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016a771c:
                      p_Var7 = context->args->filter;
                      if (p_Var7 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                          (*p_Var7)(&local_328);
                          auVar194 = ZEXT1664(local_4e8);
                          auVar266 = ZEXT1664(local_4d8);
                          auVar279 = ZEXT1664(local_4c8);
                          pRVar62 = local_4a0;
                        }
                        if (*local_328.valid == 0) goto LAB_016a77ff;
                      }
                      (((Vec3f *)((long)local_328.ray + 0x30))->field_0).components[0] =
                           *(float *)local_328.hit;
                      (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_328.hit + 4);
                      (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_328.hit + 8);
                      *(float *)((long)local_328.ray + 0x3c) = *(float *)(local_328.hit + 0xc);
                      *(float *)((long)local_328.ray + 0x40) = *(float *)(local_328.hit + 0x10);
                      *(float *)((long)local_328.ray + 0x44) = *(float *)(local_328.hit + 0x14);
                      *(float *)((long)local_328.ray + 0x48) = *(float *)(local_328.hit + 0x18);
                      *(float *)((long)local_328.ray + 0x4c) = *(float *)(local_328.hit + 0x1c);
                      *(float *)((long)local_328.ray + 0x50) = *(float *)(local_328.hit + 0x20);
                    }
                    else {
                      local_2f8._0_8_ = context;
                      (*pGVar4->intersectionFilterN)(&local_328);
                      auVar194 = ZEXT1664(local_4e8);
                      auVar266 = ZEXT1664(local_4d8);
                      auVar279 = ZEXT1664(local_4c8);
                      pRVar62 = local_4a0;
                      context = (RayQueryContext *)local_2f8._0_8_;
                      if (*local_328.valid != 0) goto LAB_016a771c;
LAB_016a77ff:
                      (pRVar62->super_RayK<1>).tfar = (float)local_3e8._0_4_;
                    }
                    auVar63 = local_498;
                    goto LAB_016a75a6;
                  }
                  (pRVar62->super_RayK<1>).tfar = fVar66;
                  auVar8 = vshufps_avx(auVar12,auVar12,0xe9);
                  uVar161 = vmovlps_avx(auVar8);
                  *(undefined8 *)&(pRVar62->Ng).field_0 = uVar161;
                  (pRVar62->Ng).field_0.field_0.z = auVar12._0_4_;
                  uVar161 = vmovlps_avx(auVar99);
                  pRVar62->u = (float)(int)uVar161;
                  pRVar62->v = (float)(int)((ulong)uVar161 >> 0x20);
                  pRVar62->primID = (uint)local_3f0;
                  pRVar62->geomID = uVar55;
                  pRVar62->instID[0] = context->user->instID[0];
                  pRVar62->instPrimID[0] = context->user->instPrimID[0];
                }
                break;
              }
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
          }
          else {
            bVar43 = false;
          }
        }
      }
      auVar279 = ZEXT1664(local_4c8);
      auVar266 = ZEXT1664(local_4d8);
      auVar194 = ZEXT1664(local_4e8);
LAB_016a75a6:
      auVar170 = auVar194._0_16_;
      auVar12 = local_428._0_16_;
    } while (bVar43);
    local_428._0_16_ = auVar12;
    local_248 = vinsertps_avx(local_428._0_16_,ZEXT416((uint)local_448),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }